

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx::CurveNiIntersectorK<8,8>::
     occluded_n<embree::avx::OrientedCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Primitive PVar12;
  Geometry *pGVar13;
  RTCFilterFunctionN p_Var14;
  void *pvVar15;
  __int_type_conflict _Var16;
  long lVar17;
  long lVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  bool bVar65;
  bool bVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  bool bVar69;
  bool bVar70;
  bool bVar71;
  bool bVar72;
  bool bVar73;
  bool bVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  bool bVar81;
  uint uVar82;
  ulong uVar83;
  long lVar84;
  uint uVar85;
  uint uVar87;
  long lVar88;
  ulong uVar89;
  ulong uVar90;
  bool bVar91;
  float t1;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar94 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  float fVar150;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar174;
  float fVar175;
  float fVar177;
  float fVar178;
  float fVar179;
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  float fVar176;
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  float fVar180;
  float fVar197;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar195;
  float fVar196;
  float fVar198;
  float fVar199;
  float fVar200;
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  float fVar201;
  float fVar219;
  float fVar220;
  undefined1 auVar202 [16];
  float fVar221;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar222;
  float fVar223;
  float fVar224;
  undefined1 auVar218 [32];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  float fVar241;
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar231 [16];
  undefined1 auVar238 [32];
  float fVar240;
  undefined1 auVar239 [32];
  vfloat4 b0;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  __m128 a;
  float fVar294;
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  float fVar295;
  float fVar306;
  float fVar307;
  vfloat4 a0_1;
  float fVar308;
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  float fVar309;
  float fVar318;
  undefined1 auVar311 [16];
  float fVar310;
  float fVar315;
  float fVar317;
  float fVar319;
  undefined1 auVar312 [16];
  float fVar314;
  float fVar316;
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar324;
  float fVar325;
  float in_register_0000151c;
  undefined1 auVar313 [32];
  float fVar326;
  undefined1 auVar328 [16];
  float fVar334;
  undefined1 auVar327 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  float fVar333;
  undefined1 auVar331 [32];
  float fVar335;
  float fVar336;
  undefined1 auVar332 [32];
  float fVar337;
  float fVar347;
  undefined1 auVar339 [16];
  float fVar338;
  float fVar344;
  float fVar346;
  undefined1 auVar340 [16];
  float fVar343;
  float fVar345;
  float in_register_0000159c;
  undefined1 auVar341 [32];
  undefined1 auVar342 [64];
  vfloat4 a0;
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  float in_register_000015dc;
  undefined1 auVar355 [64];
  vfloat_impl<4> p03;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_6f1;
  undefined1 local_6b0 [8];
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float local_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float local_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  undefined1 local_4f0 [8];
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  undefined1 local_4d0 [8];
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  undefined1 local_4b0 [8];
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  uint auStack_490 [4];
  RTCFilterFunctionNArguments local_480;
  undefined1 local_450 [8];
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  undefined1 local_430 [8];
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  undefined1 local_410 [8];
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  float afStack_320 [8];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar86;
  undefined1 auVar173 [32];
  undefined1 auVar354 [32];
  
  PVar12 = prim[1];
  uVar83 = (ulong)(byte)PVar12;
  lVar88 = uVar83 * 5;
  fVar201 = *(float *)(prim + uVar83 * 0x19 + 0x12);
  auVar117 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar117 = vinsertps_avx(auVar117,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar229 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar229 = vinsertps_avx(auVar229,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar117 = vsubps_avx(auVar117,*(undefined1 (*) [16])(prim + uVar83 * 0x19 + 6));
  auVar108._0_4_ = fVar201 * auVar117._0_4_;
  auVar108._4_4_ = fVar201 * auVar117._4_4_;
  auVar108._8_4_ = fVar201 * auVar117._8_4_;
  auVar108._12_4_ = fVar201 * auVar117._12_4_;
  auVar202._0_4_ = fVar201 * auVar229._0_4_;
  auVar202._4_4_ = fVar201 * auVar229._4_4_;
  auVar202._8_4_ = fVar201 * auVar229._8_4_;
  auVar202._12_4_ = fVar201 * auVar229._12_4_;
  auVar117 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 4 + 6)));
  auVar229 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 4 + 10)));
  auVar97._16_16_ = auVar229;
  auVar97._0_16_ = auVar117;
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar117 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar88 + 6)));
  auVar229 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar88 + 10)));
  auVar143._16_16_ = auVar229;
  auVar143._0_16_ = auVar117;
  auVar117 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 6 + 6)));
  auVar229 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 6 + 10)));
  auVar19 = vcvtdq2ps_avx(auVar143);
  auVar166._16_16_ = auVar229;
  auVar166._0_16_ = auVar117;
  auVar20 = vcvtdq2ps_avx(auVar166);
  auVar117 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0xb + 6)));
  auVar229 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0xb + 10)));
  auVar191._16_16_ = auVar229;
  auVar191._0_16_ = auVar117;
  uVar90 = (ulong)((uint)(byte)PVar12 * 0xc);
  auVar117 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar191);
  auVar229 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 + 10)));
  auVar236._16_16_ = auVar229;
  auVar236._0_16_ = auVar117;
  auVar22 = vcvtdq2ps_avx(auVar236);
  auVar117 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 + uVar83 + 6)));
  auVar229 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 + uVar83 + 10)));
  auVar249._16_16_ = auVar229;
  auVar249._0_16_ = auVar117;
  auVar23 = vcvtdq2ps_avx(auVar249);
  lVar84 = uVar83 * 9;
  uVar90 = (ulong)(uint)((int)lVar84 * 2);
  auVar117 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 + 6)));
  auVar229 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 + 10)));
  auVar266._16_16_ = auVar229;
  auVar266._0_16_ = auVar117;
  auVar117 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 + uVar83 + 6)));
  auVar229 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 + uVar83 + 10)));
  auVar24 = vcvtdq2ps_avx(auVar266);
  auVar283._16_16_ = auVar229;
  auVar283._0_16_ = auVar117;
  auVar25 = vcvtdq2ps_avx(auVar283);
  uVar90 = (ulong)(uint)((int)lVar88 << 2);
  auVar117 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 + 6)));
  auVar229 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 + 10)));
  auVar291._16_16_ = auVar229;
  auVar291._0_16_ = auVar117;
  auVar26 = vcvtdq2ps_avx(auVar291);
  auVar117 = vshufps_avx(auVar202,auVar202,0);
  auVar229 = vshufps_avx(auVar202,auVar202,0x55);
  auVar216 = vshufps_avx(auVar202,auVar202,0xaa);
  fVar201 = auVar216._0_4_;
  fVar219 = auVar216._4_4_;
  fVar220 = auVar216._8_4_;
  fVar221 = auVar216._12_4_;
  fVar222 = auVar229._0_4_;
  fVar223 = auVar229._4_4_;
  fVar224 = auVar229._8_4_;
  fVar150 = auVar229._12_4_;
  fVar174 = auVar117._0_4_;
  fVar175 = auVar117._4_4_;
  fVar176 = auVar117._8_4_;
  fVar177 = auVar117._12_4_;
  auVar313._0_4_ = fVar174 * auVar97._0_4_ + fVar222 * auVar19._0_4_ + fVar201 * auVar20._0_4_;
  auVar313._4_4_ = fVar175 * auVar97._4_4_ + fVar223 * auVar19._4_4_ + fVar219 * auVar20._4_4_;
  auVar313._8_4_ = fVar176 * auVar97._8_4_ + fVar224 * auVar19._8_4_ + fVar220 * auVar20._8_4_;
  auVar313._12_4_ = fVar177 * auVar97._12_4_ + fVar150 * auVar19._12_4_ + fVar221 * auVar20._12_4_;
  auVar313._16_4_ = fVar174 * auVar97._16_4_ + fVar222 * auVar19._16_4_ + fVar201 * auVar20._16_4_;
  auVar313._20_4_ = fVar175 * auVar97._20_4_ + fVar223 * auVar19._20_4_ + fVar219 * auVar20._20_4_;
  auVar313._24_4_ = fVar176 * auVar97._24_4_ + fVar224 * auVar19._24_4_ + fVar220 * auVar20._24_4_;
  auVar313._28_4_ = fVar150 + in_register_000015dc + in_register_0000151c;
  auVar304._0_4_ = fVar174 * auVar21._0_4_ + fVar222 * auVar22._0_4_ + fVar201 * auVar23._0_4_;
  auVar304._4_4_ = fVar175 * auVar21._4_4_ + fVar223 * auVar22._4_4_ + fVar219 * auVar23._4_4_;
  auVar304._8_4_ = fVar176 * auVar21._8_4_ + fVar224 * auVar22._8_4_ + fVar220 * auVar23._8_4_;
  auVar304._12_4_ = fVar177 * auVar21._12_4_ + fVar150 * auVar22._12_4_ + fVar221 * auVar23._12_4_;
  auVar304._16_4_ = fVar174 * auVar21._16_4_ + fVar222 * auVar22._16_4_ + fVar201 * auVar23._16_4_;
  auVar304._20_4_ = fVar175 * auVar21._20_4_ + fVar223 * auVar22._20_4_ + fVar219 * auVar23._20_4_;
  auVar304._24_4_ = fVar176 * auVar21._24_4_ + fVar224 * auVar22._24_4_ + fVar220 * auVar23._24_4_;
  auVar304._28_4_ = fVar150 + in_register_000015dc + in_register_0000159c;
  auVar218._0_4_ = fVar174 * auVar24._0_4_ + fVar222 * auVar25._0_4_ + auVar26._0_4_ * fVar201;
  auVar218._4_4_ = fVar175 * auVar24._4_4_ + fVar223 * auVar25._4_4_ + auVar26._4_4_ * fVar219;
  auVar218._8_4_ = fVar176 * auVar24._8_4_ + fVar224 * auVar25._8_4_ + auVar26._8_4_ * fVar220;
  auVar218._12_4_ = fVar177 * auVar24._12_4_ + fVar150 * auVar25._12_4_ + auVar26._12_4_ * fVar221;
  auVar218._16_4_ = fVar174 * auVar24._16_4_ + fVar222 * auVar25._16_4_ + auVar26._16_4_ * fVar201;
  auVar218._20_4_ = fVar175 * auVar24._20_4_ + fVar223 * auVar25._20_4_ + auVar26._20_4_ * fVar219;
  auVar218._24_4_ = fVar176 * auVar24._24_4_ + fVar224 * auVar25._24_4_ + auVar26._24_4_ * fVar220;
  auVar218._28_4_ = fVar177 + fVar150 + fVar221;
  auVar117 = vshufps_avx(auVar108,auVar108,0);
  auVar229 = vshufps_avx(auVar108,auVar108,0x55);
  auVar216 = vshufps_avx(auVar108,auVar108,0xaa);
  fVar219 = auVar216._0_4_;
  fVar220 = auVar216._4_4_;
  fVar221 = auVar216._8_4_;
  fVar222 = auVar216._12_4_;
  fVar175 = auVar229._0_4_;
  fVar176 = auVar229._4_4_;
  fVar177 = auVar229._8_4_;
  fVar178 = auVar229._12_4_;
  fVar223 = auVar117._0_4_;
  fVar224 = auVar117._4_4_;
  fVar150 = auVar117._8_4_;
  fVar174 = auVar117._12_4_;
  fVar201 = auVar97._28_4_;
  auVar237._0_4_ = fVar223 * auVar97._0_4_ + fVar175 * auVar19._0_4_ + fVar219 * auVar20._0_4_;
  auVar237._4_4_ = fVar224 * auVar97._4_4_ + fVar176 * auVar19._4_4_ + fVar220 * auVar20._4_4_;
  auVar237._8_4_ = fVar150 * auVar97._8_4_ + fVar177 * auVar19._8_4_ + fVar221 * auVar20._8_4_;
  auVar237._12_4_ = fVar174 * auVar97._12_4_ + fVar178 * auVar19._12_4_ + fVar222 * auVar20._12_4_;
  auVar237._16_4_ = fVar223 * auVar97._16_4_ + fVar175 * auVar19._16_4_ + fVar219 * auVar20._16_4_;
  auVar237._20_4_ = fVar224 * auVar97._20_4_ + fVar176 * auVar19._20_4_ + fVar220 * auVar20._20_4_;
  auVar237._24_4_ = fVar150 * auVar97._24_4_ + fVar177 * auVar19._24_4_ + fVar221 * auVar20._24_4_;
  auVar237._28_4_ = fVar201 + auVar19._28_4_ + auVar20._28_4_;
  auVar144._0_4_ = fVar223 * auVar21._0_4_ + fVar175 * auVar22._0_4_ + fVar219 * auVar23._0_4_;
  auVar144._4_4_ = fVar224 * auVar21._4_4_ + fVar176 * auVar22._4_4_ + fVar220 * auVar23._4_4_;
  auVar144._8_4_ = fVar150 * auVar21._8_4_ + fVar177 * auVar22._8_4_ + fVar221 * auVar23._8_4_;
  auVar144._12_4_ = fVar174 * auVar21._12_4_ + fVar178 * auVar22._12_4_ + fVar222 * auVar23._12_4_;
  auVar144._16_4_ = fVar223 * auVar21._16_4_ + fVar175 * auVar22._16_4_ + fVar219 * auVar23._16_4_;
  auVar144._20_4_ = fVar224 * auVar21._20_4_ + fVar176 * auVar22._20_4_ + fVar220 * auVar23._20_4_;
  auVar144._24_4_ = fVar150 * auVar21._24_4_ + fVar177 * auVar22._24_4_ + fVar221 * auVar23._24_4_;
  auVar144._28_4_ = fVar201 + auVar20._28_4_ + auVar23._28_4_;
  auVar126._0_4_ = fVar223 * auVar24._0_4_ + fVar175 * auVar25._0_4_ + auVar26._0_4_ * fVar219;
  auVar126._4_4_ = fVar224 * auVar24._4_4_ + fVar176 * auVar25._4_4_ + auVar26._4_4_ * fVar220;
  auVar126._8_4_ = fVar150 * auVar24._8_4_ + fVar177 * auVar25._8_4_ + auVar26._8_4_ * fVar221;
  auVar126._12_4_ = fVar174 * auVar24._12_4_ + fVar178 * auVar25._12_4_ + auVar26._12_4_ * fVar222;
  auVar126._16_4_ = fVar223 * auVar24._16_4_ + fVar175 * auVar25._16_4_ + auVar26._16_4_ * fVar219;
  auVar126._20_4_ = fVar224 * auVar24._20_4_ + fVar176 * auVar25._20_4_ + auVar26._20_4_ * fVar220;
  auVar126._24_4_ = fVar150 * auVar24._24_4_ + fVar177 * auVar25._24_4_ + auVar26._24_4_ * fVar221;
  auVar126._28_4_ = fVar201 + auVar22._28_4_ + fVar222;
  auVar98._8_4_ = 0x7fffffff;
  auVar98._0_8_ = 0x7fffffff7fffffff;
  auVar98._12_4_ = 0x7fffffff;
  auVar98._16_4_ = 0x7fffffff;
  auVar98._20_4_ = 0x7fffffff;
  auVar98._24_4_ = 0x7fffffff;
  auVar98._28_4_ = 0x7fffffff;
  auVar167._8_4_ = 0x219392ef;
  auVar167._0_8_ = 0x219392ef219392ef;
  auVar167._12_4_ = 0x219392ef;
  auVar167._16_4_ = 0x219392ef;
  auVar167._20_4_ = 0x219392ef;
  auVar167._24_4_ = 0x219392ef;
  auVar167._28_4_ = 0x219392ef;
  auVar97 = vandps_avx(auVar313,auVar98);
  auVar97 = vcmpps_avx(auVar97,auVar167,1);
  auVar19 = vblendvps_avx(auVar313,auVar167,auVar97);
  auVar97 = vandps_avx(auVar304,auVar98);
  auVar97 = vcmpps_avx(auVar97,auVar167,1);
  auVar20 = vblendvps_avx(auVar304,auVar167,auVar97);
  auVar97 = vandps_avx(auVar218,auVar98);
  auVar97 = vcmpps_avx(auVar97,auVar167,1);
  auVar97 = vblendvps_avx(auVar218,auVar167,auVar97);
  auVar21 = vrcpps_avx(auVar19);
  fVar201 = auVar21._0_4_;
  fVar219 = auVar21._4_4_;
  auVar22._4_4_ = auVar19._4_4_ * fVar219;
  auVar22._0_4_ = auVar19._0_4_ * fVar201;
  fVar220 = auVar21._8_4_;
  auVar22._8_4_ = auVar19._8_4_ * fVar220;
  fVar221 = auVar21._12_4_;
  auVar22._12_4_ = auVar19._12_4_ * fVar221;
  fVar222 = auVar21._16_4_;
  auVar22._16_4_ = auVar19._16_4_ * fVar222;
  fVar223 = auVar21._20_4_;
  auVar22._20_4_ = auVar19._20_4_ * fVar223;
  fVar224 = auVar21._24_4_;
  auVar22._24_4_ = auVar19._24_4_ * fVar224;
  auVar22._28_4_ = auVar19._28_4_;
  auVar267._8_4_ = 0x3f800000;
  auVar267._0_8_ = &DAT_3f8000003f800000;
  auVar267._12_4_ = 0x3f800000;
  auVar267._16_4_ = 0x3f800000;
  auVar267._20_4_ = 0x3f800000;
  auVar267._24_4_ = 0x3f800000;
  auVar267._28_4_ = 0x3f800000;
  auVar22 = vsubps_avx(auVar267,auVar22);
  fVar201 = fVar201 + fVar201 * auVar22._0_4_;
  fVar219 = fVar219 + fVar219 * auVar22._4_4_;
  fVar220 = fVar220 + fVar220 * auVar22._8_4_;
  fVar221 = fVar221 + fVar221 * auVar22._12_4_;
  fVar222 = fVar222 + fVar222 * auVar22._16_4_;
  fVar223 = fVar223 + fVar223 * auVar22._20_4_;
  fVar224 = fVar224 + fVar224 * auVar22._24_4_;
  auVar19 = vrcpps_avx(auVar20);
  fVar150 = auVar19._0_4_;
  fVar174 = auVar19._4_4_;
  auVar23._4_4_ = fVar174 * auVar20._4_4_;
  auVar23._0_4_ = fVar150 * auVar20._0_4_;
  fVar175 = auVar19._8_4_;
  auVar23._8_4_ = fVar175 * auVar20._8_4_;
  fVar176 = auVar19._12_4_;
  auVar23._12_4_ = fVar176 * auVar20._12_4_;
  fVar177 = auVar19._16_4_;
  auVar23._16_4_ = fVar177 * auVar20._16_4_;
  fVar178 = auVar19._20_4_;
  auVar23._20_4_ = fVar178 * auVar20._20_4_;
  fVar179 = auVar19._24_4_;
  auVar23._24_4_ = fVar179 * auVar20._24_4_;
  auVar23._28_4_ = auVar22._28_4_;
  auVar19 = vsubps_avx(auVar267,auVar23);
  fVar150 = fVar150 + fVar150 * auVar19._0_4_;
  fVar174 = fVar174 + fVar174 * auVar19._4_4_;
  fVar175 = fVar175 + fVar175 * auVar19._8_4_;
  fVar176 = fVar176 + fVar176 * auVar19._12_4_;
  fVar177 = fVar177 + fVar177 * auVar19._16_4_;
  fVar178 = fVar178 + fVar178 * auVar19._20_4_;
  fVar179 = fVar179 + fVar179 * auVar19._24_4_;
  auVar19 = vrcpps_avx(auVar97);
  fVar180 = auVar19._0_4_;
  fVar195 = auVar19._4_4_;
  auVar20._4_4_ = fVar195 * auVar97._4_4_;
  auVar20._0_4_ = fVar180 * auVar97._0_4_;
  fVar196 = auVar19._8_4_;
  auVar20._8_4_ = fVar196 * auVar97._8_4_;
  fVar197 = auVar19._12_4_;
  auVar20._12_4_ = fVar197 * auVar97._12_4_;
  fVar198 = auVar19._16_4_;
  auVar20._16_4_ = fVar198 * auVar97._16_4_;
  fVar199 = auVar19._20_4_;
  auVar20._20_4_ = fVar199 * auVar97._20_4_;
  fVar200 = auVar19._24_4_;
  auVar20._24_4_ = fVar200 * auVar97._24_4_;
  auVar20._28_4_ = auVar97._28_4_;
  auVar97 = vsubps_avx(auVar267,auVar20);
  auVar117._8_8_ = 0;
  auVar117._0_8_ = *(ulong *)(prim + uVar83 * 7 + 6);
  auVar117 = vpmovsxwd_avx(auVar117);
  auVar229._8_8_ = 0;
  auVar229._0_8_ = *(ulong *)(prim + uVar83 * 7 + 0xe);
  auVar229 = vpmovsxwd_avx(auVar229);
  fVar180 = fVar180 + fVar180 * auVar97._0_4_;
  fVar195 = fVar195 + fVar195 * auVar97._4_4_;
  fVar196 = fVar196 + fVar196 * auVar97._8_4_;
  fVar197 = fVar197 + fVar197 * auVar97._12_4_;
  fVar198 = fVar198 + fVar198 * auVar97._16_4_;
  fVar199 = fVar199 + fVar199 * auVar97._20_4_;
  fVar200 = fVar200 + fVar200 * auVar97._24_4_;
  auVar99._16_16_ = auVar229;
  auVar99._0_16_ = auVar117;
  auVar97 = vcvtdq2ps_avx(auVar99);
  auVar97 = vsubps_avx(auVar97,auVar237);
  auVar216._8_8_ = 0;
  auVar216._0_8_ = *(ulong *)(prim + lVar84 + 6);
  auVar117 = vpmovsxwd_avx(auVar216);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + lVar84 + 0xe);
  auVar229 = vpmovsxwd_avx(auVar9);
  auVar92._0_4_ = fVar201 * auVar97._0_4_;
  auVar92._4_4_ = fVar219 * auVar97._4_4_;
  auVar92._8_4_ = fVar220 * auVar97._8_4_;
  auVar92._12_4_ = fVar221 * auVar97._12_4_;
  auVar24._16_4_ = fVar222 * auVar97._16_4_;
  auVar24._0_16_ = auVar92;
  auVar24._20_4_ = fVar223 * auVar97._20_4_;
  auVar24._24_4_ = fVar224 * auVar97._24_4_;
  auVar24._28_4_ = auVar97._28_4_;
  auVar250._16_16_ = auVar229;
  auVar250._0_16_ = auVar117;
  auVar97 = vcvtdq2ps_avx(auVar250);
  auVar97 = vsubps_avx(auVar97,auVar237);
  lVar88 = (ulong)(byte)PVar12 * 0x10;
  auVar298._8_8_ = 0;
  auVar298._0_8_ = *(ulong *)(prim + lVar88 + 6);
  auVar117 = vpmovsxwd_avx(auVar298);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + lVar88 + 0xe);
  auVar229 = vpmovsxwd_avx(auVar10);
  lVar88 = lVar88 + uVar83 * -2;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + lVar88 + 6);
  auVar216 = vpmovsxwd_avx(auVar11);
  auVar162._8_8_ = 0;
  auVar162._0_8_ = *(ulong *)(prim + lVar88 + 0xe);
  auVar9 = vpmovsxwd_avx(auVar162);
  auVar203._0_4_ = fVar201 * auVar97._0_4_;
  auVar203._4_4_ = fVar219 * auVar97._4_4_;
  auVar203._8_4_ = fVar220 * auVar97._8_4_;
  auVar203._12_4_ = fVar221 * auVar97._12_4_;
  auVar25._16_4_ = fVar222 * auVar97._16_4_;
  auVar25._0_16_ = auVar203;
  auVar25._20_4_ = fVar223 * auVar97._20_4_;
  auVar25._24_4_ = fVar224 * auVar97._24_4_;
  auVar25._28_4_ = auVar21._28_4_ + auVar22._28_4_;
  auVar238._16_16_ = auVar9;
  auVar238._0_16_ = auVar216;
  auVar97 = vcvtdq2ps_avx(auVar238);
  auVar97 = vsubps_avx(auVar97,auVar144);
  auVar225._0_4_ = fVar150 * auVar97._0_4_;
  auVar225._4_4_ = fVar174 * auVar97._4_4_;
  auVar225._8_4_ = fVar175 * auVar97._8_4_;
  auVar225._12_4_ = fVar176 * auVar97._12_4_;
  auVar21._16_4_ = fVar177 * auVar97._16_4_;
  auVar21._0_16_ = auVar225;
  auVar21._20_4_ = fVar178 * auVar97._20_4_;
  auVar21._24_4_ = fVar179 * auVar97._24_4_;
  auVar21._28_4_ = auVar97._28_4_;
  auVar251._16_16_ = auVar229;
  auVar251._0_16_ = auVar117;
  auVar97 = vcvtdq2ps_avx(auVar251);
  auVar97 = vsubps_avx(auVar97,auVar144);
  auVar116._8_8_ = 0;
  auVar116._0_8_ = *(ulong *)(prim + uVar90 + uVar83 + 6);
  auVar117 = vpmovsxwd_avx(auVar116);
  auVar161._8_8_ = 0;
  auVar161._0_8_ = *(ulong *)(prim + uVar90 + uVar83 + 0xe);
  auVar229 = vpmovsxwd_avx(auVar161);
  auVar132._0_4_ = fVar150 * auVar97._0_4_;
  auVar132._4_4_ = fVar174 * auVar97._4_4_;
  auVar132._8_4_ = fVar175 * auVar97._8_4_;
  auVar132._12_4_ = fVar176 * auVar97._12_4_;
  auVar26._16_4_ = fVar177 * auVar97._16_4_;
  auVar26._0_16_ = auVar132;
  auVar26._20_4_ = fVar178 * auVar97._20_4_;
  auVar26._24_4_ = fVar179 * auVar97._24_4_;
  auVar26._28_4_ = auVar97._28_4_;
  auVar168._16_16_ = auVar229;
  auVar168._0_16_ = auVar117;
  auVar97 = vcvtdq2ps_avx(auVar168);
  auVar97 = vsubps_avx(auVar97,auVar126);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar83 * 0x17 + 6);
  auVar117 = vpmovsxwd_avx(auVar95);
  auVar136._8_8_ = 0;
  auVar136._0_8_ = *(ulong *)(prim + uVar83 * 0x17 + 0xe);
  auVar229 = vpmovsxwd_avx(auVar136);
  auVar151._0_4_ = fVar180 * auVar97._0_4_;
  auVar151._4_4_ = fVar195 * auVar97._4_4_;
  auVar151._8_4_ = fVar196 * auVar97._8_4_;
  auVar151._12_4_ = fVar197 * auVar97._12_4_;
  auVar27._16_4_ = fVar198 * auVar97._16_4_;
  auVar27._0_16_ = auVar151;
  auVar27._20_4_ = fVar199 * auVar97._20_4_;
  auVar27._24_4_ = fVar200 * auVar97._24_4_;
  auVar27._28_4_ = auVar97._28_4_;
  auVar252._16_16_ = auVar229;
  auVar252._0_16_ = auVar117;
  auVar97 = vcvtdq2ps_avx(auVar252);
  auVar97 = vsubps_avx(auVar97,auVar126);
  auVar109._0_4_ = fVar180 * auVar97._0_4_;
  auVar109._4_4_ = fVar195 * auVar97._4_4_;
  auVar109._8_4_ = fVar196 * auVar97._8_4_;
  auVar109._12_4_ = fVar197 * auVar97._12_4_;
  auVar28._16_4_ = fVar198 * auVar97._16_4_;
  auVar28._0_16_ = auVar109;
  auVar28._20_4_ = fVar199 * auVar97._20_4_;
  auVar28._24_4_ = fVar200 * auVar97._24_4_;
  auVar28._28_4_ = auVar97._28_4_;
  auVar117 = vpminsd_avx(auVar24._16_16_,auVar25._16_16_);
  auVar229 = vpminsd_avx(auVar92,auVar203);
  auVar292._16_16_ = auVar117;
  auVar292._0_16_ = auVar229;
  auVar117 = vpminsd_avx(auVar21._16_16_,auVar26._16_16_);
  auVar229 = vpminsd_avx(auVar225,auVar132);
  auVar305._16_16_ = auVar117;
  auVar305._0_16_ = auVar229;
  auVar97 = vmaxps_avx(auVar292,auVar305);
  auVar117 = vpminsd_avx(auVar27._16_16_,auVar28._16_16_);
  auVar229 = vpminsd_avx(auVar151,auVar109);
  auVar331._16_16_ = auVar117;
  auVar331._0_16_ = auVar229;
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar341._4_4_ = uVar6;
  auVar341._0_4_ = uVar6;
  auVar341._8_4_ = uVar6;
  auVar341._12_4_ = uVar6;
  auVar341._16_4_ = uVar6;
  auVar341._20_4_ = uVar6;
  auVar341._24_4_ = uVar6;
  auVar341._28_4_ = uVar6;
  auVar19 = vmaxps_avx(auVar331,auVar341);
  auVar97 = vmaxps_avx(auVar97,auVar19);
  local_2c0._4_4_ = auVar97._4_4_ * 0.99999964;
  local_2c0._0_4_ = auVar97._0_4_ * 0.99999964;
  local_2c0._8_4_ = auVar97._8_4_ * 0.99999964;
  local_2c0._12_4_ = auVar97._12_4_ * 0.99999964;
  local_2c0._16_4_ = auVar97._16_4_ * 0.99999964;
  local_2c0._20_4_ = auVar97._20_4_ * 0.99999964;
  local_2c0._24_4_ = auVar97._24_4_ * 0.99999964;
  local_2c0._28_4_ = auVar97._28_4_;
  auVar117 = vpmaxsd_avx(auVar24._16_16_,auVar25._16_16_);
  auVar229 = vpmaxsd_avx(auVar92,auVar203);
  auVar100._16_16_ = auVar117;
  auVar100._0_16_ = auVar229;
  auVar117 = vpmaxsd_avx(auVar21._16_16_,auVar26._16_16_);
  auVar229 = vpmaxsd_avx(auVar225,auVar132);
  auVar145._16_16_ = auVar117;
  auVar145._0_16_ = auVar229;
  auVar97 = vminps_avx(auVar100,auVar145);
  auVar117 = vpmaxsd_avx(auVar27._16_16_,auVar28._16_16_);
  auVar229 = vpmaxsd_avx(auVar151,auVar109);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar169._4_4_ = uVar6;
  auVar169._0_4_ = uVar6;
  auVar169._8_4_ = uVar6;
  auVar169._12_4_ = uVar6;
  auVar169._16_4_ = uVar6;
  auVar169._20_4_ = uVar6;
  auVar169._24_4_ = uVar6;
  auVar169._28_4_ = uVar6;
  auVar127._16_16_ = auVar117;
  auVar127._0_16_ = auVar229;
  auVar19 = vminps_avx(auVar127,auVar169);
  auVar97 = vminps_avx(auVar97,auVar19);
  auVar19._4_4_ = auVar97._4_4_ * 1.0000004;
  auVar19._0_4_ = auVar97._0_4_ * 1.0000004;
  auVar19._8_4_ = auVar97._8_4_ * 1.0000004;
  auVar19._12_4_ = auVar97._12_4_ * 1.0000004;
  auVar19._16_4_ = auVar97._16_4_ * 1.0000004;
  auVar19._20_4_ = auVar97._20_4_ * 1.0000004;
  auVar19._24_4_ = auVar97._24_4_ * 1.0000004;
  auVar19._28_4_ = auVar97._28_4_;
  auVar97 = vcmpps_avx(local_2c0,auVar19,2);
  auVar117 = vpshufd_avx(ZEXT116((byte)PVar12),0);
  auVar128._16_16_ = auVar117;
  auVar128._0_16_ = auVar117;
  auVar19 = vcvtdq2ps_avx(auVar128);
  auVar19 = vcmpps_avx(_DAT_02020f40,auVar19,1);
  auVar97 = vandps_avx(auVar97,auVar19);
  uVar82 = vmovmskps_avx(auVar97);
  local_6f1 = uVar82 != 0;
  if (uVar82 == 0) {
    return local_6f1;
  }
  uVar82 = uVar82 & 0xff;
  auVar101._16_16_ = mm_lookupmask_ps._240_16_;
  auVar101._0_16_ = mm_lookupmask_ps._240_16_;
  uVar87 = 1 << ((byte)k & 0x1f);
  local_340 = vblendps_avx(auVar101,ZEXT832(0) << 0x20,0x80);
  uVar83 = (ulong)((uVar87 & 0xf) << 4);
  lVar88 = (long)((int)uVar87 >> 4) * 0x10;
  auVar342 = ZEXT1664((undefined1  [16])0x0);
LAB_010e4d0d:
  uVar90 = (ulong)uVar82;
  lVar84 = 0;
  if (uVar90 != 0) {
    for (; (uVar82 >> lVar84 & 1) == 0; lVar84 = lVar84 + 1) {
    }
  }
  uVar82 = *(uint *)(prim + 2);
  pGVar13 = (context->scene->geometries).items[uVar82].ptr;
  uVar89 = (ulong)*(uint *)(*(long *)&pGVar13->field_0x58 +
                           pGVar13[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar84 * 4 + 6));
  p_Var14 = pGVar13[1].intersectionFilterN;
  pvVar15 = pGVar13[2].userPtr;
  _Var16 = pGVar13[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar3 = (float *)(_Var16 + uVar89 * (long)pvVar15);
  fVar201 = *pfVar3;
  fVar219 = pfVar3[1];
  fVar220 = pfVar3[2];
  fVar221 = pfVar3[3];
  pfVar4 = (float *)(_Var16 + (uVar89 + 1) * (long)pvVar15);
  pfVar5 = (float *)(_Var16 + (uVar89 + 2) * (long)pvVar15);
  pfVar3 = (float *)(_Var16 + (long)pvVar15 * (uVar89 + 3));
  fVar222 = *pfVar3;
  fVar223 = pfVar3[1];
  fVar224 = pfVar3[2];
  fVar150 = pfVar3[3];
  uVar90 = uVar90 - 1 & uVar90;
  lVar17 = *(long *)&pGVar13[1].time_range.upper;
  pfVar3 = (float *)(lVar17 + (long)p_Var14 * uVar89);
  fVar174 = *pfVar3;
  fVar175 = pfVar3[1];
  fVar176 = pfVar3[2];
  fVar177 = pfVar3[3];
  pfVar3 = (float *)(lVar17 + (long)p_Var14 * (uVar89 + 1));
  pfVar1 = (float *)(lVar17 + (long)p_Var14 * (uVar89 + 2));
  lVar18 = 0;
  if (uVar90 != 0) {
    for (; (uVar90 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
    }
  }
  pfVar2 = (float *)(lVar17 + (long)p_Var14 * (uVar89 + 3));
  fVar178 = *pfVar2;
  fVar179 = pfVar2[1];
  fVar180 = pfVar2[2];
  fVar195 = pfVar2[3];
  if (((uVar90 != 0) && (uVar89 = uVar90 - 1 & uVar90, uVar89 != 0)) && (lVar17 = 0, uVar89 != 0)) {
    for (; (uVar89 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
    }
  }
  auVar117 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar216 = vinsertps_avx(auVar117,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar196 = auVar342._8_4_;
  fVar197 = auVar342._12_4_;
  fVar198 = *pfVar1 * 0.0;
  fVar199 = pfVar1[1] * 0.0;
  fVar200 = fVar196 * pfVar1[2];
  fVar294 = fVar197 * pfVar1[3];
  fVar295 = fVar198 + fVar178 * 0.0;
  fVar306 = fVar199 + fVar179 * 0.0;
  fVar307 = fVar200 + fVar180 * fVar196;
  fVar308 = fVar294 + fVar195 * fVar197;
  fVar309 = *pfVar3 * 0.0;
  fVar314 = pfVar3[1] * 0.0;
  fVar316 = fVar196 * pfVar3[2];
  fVar318 = fVar197 * pfVar3[3];
  local_680._0_4_ = fVar174 + fVar309 + fVar295;
  local_680._4_4_ = fVar175 + fVar314 + fVar306;
  fStack_678 = fVar176 + fVar316 + fVar307;
  fStack_674 = fVar177 + fVar318 + fVar308;
  auVar133._0_4_ = fVar295 + *pfVar3 * 3.0;
  auVar133._4_4_ = fVar306 + pfVar3[1] * 3.0;
  auVar133._8_4_ = fVar307 + pfVar3[2] * 3.0;
  auVar133._12_4_ = fVar308 + pfVar3[3] * 3.0;
  auVar296._0_4_ = fVar174 * 3.0;
  auVar296._4_4_ = fVar175 * 3.0;
  auVar296._8_4_ = fVar176 * 3.0;
  auVar296._12_4_ = fVar177 * 3.0;
  auVar116 = vsubps_avx(auVar133,auVar296);
  fVar307 = *pfVar5 * 0.0;
  fVar308 = pfVar5[1] * 0.0;
  fVar333 = pfVar5[2] * fVar196;
  fVar334 = pfVar5[3] * fVar197;
  fVar295 = fVar307 + fVar222 * 0.0;
  fVar306 = fVar308 + fVar223 * 0.0;
  fVar196 = fVar333 + fVar196 * fVar224;
  fVar197 = fVar334 + fVar197 * fVar150;
  fVar337 = *pfVar4 * 0.0;
  fVar343 = pfVar4[1] * 0.0;
  fVar345 = pfVar4[2] * 0.0;
  fVar347 = pfVar4[3] * 0.0;
  auVar348._0_4_ = fVar337 + fVar295 + fVar201;
  auVar348._4_4_ = fVar343 + fVar306 + fVar219;
  auVar348._8_4_ = fVar345 + fVar196 + fVar220;
  auVar348._12_4_ = fVar347 + fVar197 + fVar221;
  auVar152._0_4_ = fVar295 + *pfVar4 * 3.0;
  auVar152._4_4_ = fVar306 + pfVar4[1] * 3.0;
  auVar152._8_4_ = fVar196 + pfVar4[2] * 3.0;
  auVar152._12_4_ = fVar197 + pfVar4[3] * 3.0;
  auVar297._0_4_ = fVar201 * 3.0;
  auVar297._4_4_ = fVar219 * 3.0;
  auVar297._8_4_ = fVar220 * 3.0;
  auVar297._12_4_ = fVar221 * 3.0;
  auVar298 = vsubps_avx(auVar152,auVar297);
  auVar254._0_4_ = fVar174 * 0.0;
  auVar254._4_4_ = fVar175 * 0.0;
  auVar254._8_4_ = fVar176 * 0.0;
  auVar254._12_4_ = fVar177 * 0.0;
  auVar153._0_4_ = auVar254._0_4_ + fVar309 + fVar198 + fVar178;
  auVar153._4_4_ = auVar254._4_4_ + fVar314 + fVar199 + fVar179;
  auVar153._8_4_ = auVar254._8_4_ + fVar316 + fVar200 + fVar180;
  auVar153._12_4_ = auVar254._12_4_ + fVar318 + fVar294 + fVar195;
  auVar270._0_4_ = fVar178 * 3.0;
  auVar270._4_4_ = fVar179 * 3.0;
  auVar270._8_4_ = fVar180 * 3.0;
  auVar270._12_4_ = fVar195 * 3.0;
  auVar181._0_4_ = *pfVar1 * 3.0;
  auVar181._4_4_ = pfVar1[1] * 3.0;
  auVar181._8_4_ = pfVar1[2] * 3.0;
  auVar181._12_4_ = pfVar1[3] * 3.0;
  auVar117 = vsubps_avx(auVar270,auVar181);
  auVar182._0_4_ = fVar309 + auVar117._0_4_;
  auVar182._4_4_ = fVar314 + auVar117._4_4_;
  auVar182._8_4_ = fVar316 + auVar117._8_4_;
  auVar182._12_4_ = fVar318 + auVar117._12_4_;
  auVar161 = vsubps_avx(auVar182,auVar254);
  auVar204._0_4_ = fVar201 * 0.0;
  auVar204._4_4_ = fVar219 * 0.0;
  auVar204._8_4_ = fVar220 * 0.0;
  auVar204._12_4_ = fVar221 * 0.0;
  auVar271._0_4_ = fVar337 + fVar307 + fVar222 + auVar204._0_4_;
  auVar271._4_4_ = fVar343 + fVar308 + fVar223 + auVar204._4_4_;
  auVar271._8_4_ = fVar345 + fVar333 + fVar224 + auVar204._8_4_;
  auVar271._12_4_ = fVar347 + fVar334 + fVar150 + auVar204._12_4_;
  auVar242._0_4_ = fVar222 * 3.0;
  auVar242._4_4_ = fVar223 * 3.0;
  auVar242._8_4_ = fVar224 * 3.0;
  auVar242._12_4_ = fVar150 * 3.0;
  auVar226._0_4_ = *pfVar5 * 3.0;
  auVar226._4_4_ = pfVar5[1] * 3.0;
  auVar226._8_4_ = pfVar5[2] * 3.0;
  auVar226._12_4_ = pfVar5[3] * 3.0;
  auVar117 = vsubps_avx(auVar242,auVar226);
  auVar227._0_4_ = fVar337 + auVar117._0_4_;
  auVar227._4_4_ = fVar343 + auVar117._4_4_;
  auVar227._8_4_ = fVar345 + auVar117._8_4_;
  auVar227._12_4_ = fVar347 + auVar117._12_4_;
  auVar11 = vsubps_avx(auVar227,auVar204);
  auVar117 = vshufps_avx(auVar116,auVar116,0xc9);
  auVar229 = vshufps_avx(auVar348,auVar348,0xc9);
  fVar180 = auVar116._0_4_;
  auVar243._0_4_ = fVar180 * auVar229._0_4_;
  fVar196 = auVar116._4_4_;
  auVar243._4_4_ = fVar196 * auVar229._4_4_;
  fVar198 = auVar116._8_4_;
  auVar243._8_4_ = fVar198 * auVar229._8_4_;
  fVar200 = auVar116._12_4_;
  auVar243._12_4_ = fVar200 * auVar229._12_4_;
  auVar255._0_4_ = auVar348._0_4_ * auVar117._0_4_;
  auVar255._4_4_ = auVar348._4_4_ * auVar117._4_4_;
  auVar255._8_4_ = auVar348._8_4_ * auVar117._8_4_;
  auVar255._12_4_ = auVar348._12_4_ * auVar117._12_4_;
  auVar229 = vsubps_avx(auVar255,auVar243);
  auVar9 = vshufps_avx(auVar229,auVar229,0xc9);
  auVar229 = vshufps_avx(auVar298,auVar298,0xc9);
  auVar244._0_4_ = fVar180 * auVar229._0_4_;
  auVar244._4_4_ = fVar196 * auVar229._4_4_;
  auVar244._8_4_ = fVar198 * auVar229._8_4_;
  auVar244._12_4_ = fVar200 * auVar229._12_4_;
  auVar205._0_4_ = auVar298._0_4_ * auVar117._0_4_;
  auVar205._4_4_ = auVar298._4_4_ * auVar117._4_4_;
  auVar205._8_4_ = auVar298._8_4_ * auVar117._8_4_;
  auVar205._12_4_ = auVar298._12_4_ * auVar117._12_4_;
  auVar117 = vsubps_avx(auVar205,auVar244);
  auVar298 = vshufps_avx(auVar117,auVar117,0xc9);
  auVar229 = vshufps_avx(auVar161,auVar161,0xc9);
  auVar117 = vshufps_avx(auVar271,auVar271,0xc9);
  fVar295 = auVar161._0_4_;
  auVar206._0_4_ = fVar295 * auVar117._0_4_;
  fVar306 = auVar161._4_4_;
  auVar206._4_4_ = fVar306 * auVar117._4_4_;
  fVar307 = auVar161._8_4_;
  auVar206._8_4_ = fVar307 * auVar117._8_4_;
  fVar308 = auVar161._12_4_;
  auVar206._12_4_ = fVar308 * auVar117._12_4_;
  auVar272._0_4_ = auVar271._0_4_ * auVar229._0_4_;
  auVar272._4_4_ = auVar271._4_4_ * auVar229._4_4_;
  auVar272._8_4_ = auVar271._8_4_ * auVar229._8_4_;
  auVar272._12_4_ = auVar271._12_4_ * auVar229._12_4_;
  auVar117 = vsubps_avx(auVar272,auVar206);
  auVar10 = vshufps_avx(auVar117,auVar117,0xc9);
  auVar117 = vshufps_avx(auVar11,auVar11,0xc9);
  auVar273._0_4_ = auVar117._0_4_ * fVar295;
  auVar273._4_4_ = auVar117._4_4_ * fVar306;
  auVar273._8_4_ = auVar117._8_4_ * fVar307;
  auVar273._12_4_ = auVar117._12_4_ * fVar308;
  auVar117 = vdpps_avx(auVar9,auVar9,0x7f);
  auVar228._0_4_ = auVar229._0_4_ * auVar11._0_4_;
  auVar228._4_4_ = auVar229._4_4_ * auVar11._4_4_;
  auVar228._8_4_ = auVar229._8_4_ * auVar11._8_4_;
  auVar228._12_4_ = auVar229._12_4_ * auVar11._12_4_;
  auVar229 = vsubps_avx(auVar228,auVar273);
  auVar11 = vshufps_avx(auVar229,auVar229,0xc9);
  fVar222 = auVar117._0_4_;
  auVar136 = ZEXT416((uint)fVar222);
  auVar229 = vrsqrtss_avx(auVar136,auVar136);
  fVar201 = auVar229._0_4_;
  auVar229 = ZEXT416((uint)(fVar201 * 1.5 - fVar222 * 0.5 * fVar201 * fVar201 * fVar201));
  auVar162 = vshufps_avx(auVar229,auVar229,0);
  auVar229 = vdpps_avx(auVar9,auVar298,0x7f);
  fVar201 = auVar9._0_4_ * auVar162._0_4_;
  fVar219 = auVar9._4_4_ * auVar162._4_4_;
  fVar220 = auVar9._8_4_ * auVar162._8_4_;
  fVar221 = auVar9._12_4_ * auVar162._12_4_;
  auVar117 = vshufps_avx(auVar117,auVar117,0);
  auVar285._0_4_ = auVar298._0_4_ * auVar117._0_4_;
  auVar285._4_4_ = auVar298._4_4_ * auVar117._4_4_;
  auVar285._8_4_ = auVar298._8_4_ * auVar117._8_4_;
  auVar285._12_4_ = auVar298._12_4_ * auVar117._12_4_;
  auVar117 = vshufps_avx(auVar229,auVar229,0);
  auVar256._0_4_ = auVar9._0_4_ * auVar117._0_4_;
  auVar256._4_4_ = auVar9._4_4_ * auVar117._4_4_;
  auVar256._8_4_ = auVar9._8_4_ * auVar117._8_4_;
  auVar256._12_4_ = auVar9._12_4_ * auVar117._12_4_;
  auVar95 = vsubps_avx(auVar285,auVar256);
  auVar117 = vrcpss_avx(auVar136,auVar136);
  auVar117 = ZEXT416((uint)(auVar117._0_4_ * (2.0 - fVar222 * auVar117._0_4_)));
  auVar9 = vshufps_avx(auVar117,auVar117,0);
  auVar117 = vdpps_avx(auVar10,auVar10,0x7f);
  fVar222 = auVar117._0_4_;
  auVar136 = ZEXT416((uint)fVar222);
  auVar229 = vrsqrtss_avx(auVar136,auVar136);
  fVar223 = auVar229._0_4_;
  auVar229 = vdpps_avx(auVar10,auVar11,0x7f);
  auVar298 = ZEXT416((uint)(fVar223 * 1.5 - fVar222 * 0.5 * fVar223 * fVar223 * fVar223));
  auVar298 = vshufps_avx(auVar298,auVar298,0);
  fVar223 = auVar298._0_4_ * auVar10._0_4_;
  fVar224 = auVar298._4_4_ * auVar10._4_4_;
  fVar150 = auVar298._8_4_ * auVar10._8_4_;
  fVar174 = auVar298._12_4_ * auVar10._12_4_;
  auVar117 = vshufps_avx(auVar117,auVar117,0);
  auVar245._0_4_ = auVar117._0_4_ * auVar11._0_4_;
  auVar245._4_4_ = auVar117._4_4_ * auVar11._4_4_;
  auVar245._8_4_ = auVar117._8_4_ * auVar11._8_4_;
  auVar245._12_4_ = auVar117._12_4_ * auVar11._12_4_;
  auVar117 = vshufps_avx(auVar229,auVar229,0);
  auVar207._0_4_ = auVar117._0_4_ * auVar10._0_4_;
  auVar207._4_4_ = auVar117._4_4_ * auVar10._4_4_;
  auVar207._8_4_ = auVar117._8_4_ * auVar10._8_4_;
  auVar207._12_4_ = auVar117._12_4_ * auVar10._12_4_;
  auVar11 = vsubps_avx(auVar245,auVar207);
  auVar117 = vrcpss_avx(auVar136,auVar136);
  auVar117 = ZEXT416((uint)((2.0 - fVar222 * auVar117._0_4_) * auVar117._0_4_));
  auVar117 = vshufps_avx(auVar117,auVar117,0);
  auVar229 = vshufps_avx(_local_680,_local_680,0xff);
  auVar274._0_4_ = auVar229._0_4_ * fVar201;
  auVar274._4_4_ = auVar229._4_4_ * fVar219;
  auVar274._8_4_ = auVar229._8_4_ * fVar220;
  auVar274._12_4_ = auVar229._12_4_ * fVar221;
  _local_4b0 = vsubps_avx(_local_680,auVar274);
  auVar10 = vshufps_avx(auVar116,auVar116,0xff);
  auVar230._0_4_ =
       auVar10._0_4_ * fVar201 + auVar162._0_4_ * auVar95._0_4_ * auVar9._0_4_ * auVar229._0_4_;
  auVar230._4_4_ =
       auVar10._4_4_ * fVar219 + auVar162._4_4_ * auVar95._4_4_ * auVar9._4_4_ * auVar229._4_4_;
  auVar230._8_4_ =
       auVar10._8_4_ * fVar220 + auVar162._8_4_ * auVar95._8_4_ * auVar9._8_4_ * auVar229._8_4_;
  auVar230._12_4_ =
       auVar10._12_4_ * fVar221 + auVar162._12_4_ * auVar95._12_4_ * auVar9._12_4_ * auVar229._12_4_
  ;
  auVar10 = vsubps_avx(auVar116,auVar230);
  local_4c0._0_4_ = auVar274._0_4_ + (float)local_680._0_4_;
  local_4c0._4_4_ = auVar274._4_4_ + (float)local_680._4_4_;
  fStack_4b8 = auVar274._8_4_ + fStack_678;
  fStack_4b4 = auVar274._12_4_ + fStack_674;
  auVar229 = vshufps_avx(auVar153,auVar153,0xff);
  auVar134._0_4_ = fVar223 * auVar229._0_4_;
  auVar134._4_4_ = fVar224 * auVar229._4_4_;
  auVar134._8_4_ = fVar150 * auVar229._8_4_;
  auVar134._12_4_ = fVar174 * auVar229._12_4_;
  _local_4d0 = vsubps_avx(auVar153,auVar134);
  auVar9 = vshufps_avx(auVar161,auVar161,0xff);
  auVar110._0_4_ =
       fVar223 * auVar9._0_4_ + auVar229._0_4_ * auVar298._0_4_ * auVar11._0_4_ * auVar117._0_4_;
  auVar110._4_4_ =
       fVar224 * auVar9._4_4_ + auVar229._4_4_ * auVar298._4_4_ * auVar11._4_4_ * auVar117._4_4_;
  auVar110._8_4_ =
       fVar150 * auVar9._8_4_ + auVar229._8_4_ * auVar298._8_4_ * auVar11._8_4_ * auVar117._8_4_;
  auVar110._12_4_ =
       fVar174 * auVar9._12_4_ +
       auVar229._12_4_ * auVar298._12_4_ * auVar11._12_4_ * auVar117._12_4_;
  auVar298 = vsubps_avx(auVar161,auVar110);
  fVar195 = auVar153._0_4_ + auVar134._0_4_;
  fVar197 = auVar153._4_4_ + auVar134._4_4_;
  fVar199 = auVar153._8_4_ + auVar134._8_4_;
  fVar294 = auVar153._12_4_ + auVar134._12_4_;
  local_4e0._0_4_ = local_4b0._0_4_ + auVar10._0_4_ * 0.33333334;
  local_4e0._4_4_ = local_4b0._4_4_ + auVar10._4_4_ * 0.33333334;
  fStack_4d8 = local_4b0._8_4_ + auVar10._8_4_ * 0.33333334;
  fStack_4d4 = local_4b0._12_4_ + auVar10._12_4_ * 0.33333334;
  local_380 = vsubps_avx(_local_4b0,auVar216);
  auVar229 = vmovsldup_avx(local_380);
  auVar117 = vmovshdup_avx(local_380);
  auVar9 = vshufps_avx(local_380,local_380,0xaa);
  fVar201 = pre->ray_space[k].vx.field_0.m128[0];
  fVar219 = pre->ray_space[k].vx.field_0.m128[1];
  fVar220 = pre->ray_space[k].vx.field_0.m128[2];
  fVar221 = pre->ray_space[k].vx.field_0.m128[3];
  fVar222 = pre->ray_space[k].vy.field_0.m128[0];
  fVar223 = pre->ray_space[k].vy.field_0.m128[1];
  fVar224 = pre->ray_space[k].vy.field_0.m128[2];
  fVar150 = pre->ray_space[k].vy.field_0.m128[3];
  fVar174 = pre->ray_space[k].vz.field_0.m128[0];
  fVar175 = pre->ray_space[k].vz.field_0.m128[1];
  fVar176 = pre->ray_space[k].vz.field_0.m128[2];
  fVar177 = pre->ray_space[k].vz.field_0.m128[3];
  auVar311._0_4_ = fVar201 * auVar229._0_4_ + auVar9._0_4_ * fVar174 + fVar222 * auVar117._0_4_;
  auVar311._4_4_ = fVar219 * auVar229._4_4_ + auVar9._4_4_ * fVar175 + fVar223 * auVar117._4_4_;
  auVar311._8_4_ = fVar220 * auVar229._8_4_ + auVar9._8_4_ * fVar176 + fVar224 * auVar117._8_4_;
  auVar311._12_4_ = fVar221 * auVar229._12_4_ + auVar9._12_4_ * fVar177 + fVar150 * auVar117._12_4_;
  local_390 = vsubps_avx(_local_4e0,auVar216);
  auVar9 = vshufps_avx(local_390,local_390,0xaa);
  auVar117 = vmovshdup_avx(local_390);
  auVar229 = vmovsldup_avx(local_390);
  fVar178 = auVar229._0_4_ * fVar201 + auVar117._0_4_ * fVar222 + fVar174 * auVar9._0_4_;
  fVar179 = auVar229._4_4_ * fVar219 + auVar117._4_4_ * fVar223 + fVar175 * auVar9._4_4_;
  local_6b0._4_4_ = fVar179;
  local_6b0._0_4_ = fVar178;
  fStack_6a8 = auVar229._8_4_ * fVar220 + auVar117._8_4_ * fVar224 + fVar176 * auVar9._8_4_;
  fStack_6a4 = auVar229._12_4_ * fVar221 + auVar117._12_4_ * fVar150 + fVar177 * auVar9._12_4_;
  auVar208._0_4_ = auVar298._0_4_ * 0.33333334;
  auVar208._4_4_ = auVar298._4_4_ * 0.33333334;
  auVar208._8_4_ = auVar298._8_4_ * 0.33333334;
  auVar208._12_4_ = auVar298._12_4_ * 0.33333334;
  _local_4f0 = vsubps_avx(_local_4d0,auVar208);
  local_3a0 = vsubps_avx(_local_4f0,auVar216);
  auVar9 = vshufps_avx(local_3a0,local_3a0,0xaa);
  auVar117 = vmovshdup_avx(local_3a0);
  auVar229 = vmovsldup_avx(local_3a0);
  auVar339._0_4_ = auVar229._0_4_ * fVar201 + auVar117._0_4_ * fVar222 + fVar174 * auVar9._0_4_;
  auVar339._4_4_ = auVar229._4_4_ * fVar219 + auVar117._4_4_ * fVar223 + fVar175 * auVar9._4_4_;
  auVar339._8_4_ = auVar229._8_4_ * fVar220 + auVar117._8_4_ * fVar224 + fVar176 * auVar9._8_4_;
  auVar339._12_4_ = auVar229._12_4_ * fVar221 + auVar117._12_4_ * fVar150 + fVar177 * auVar9._12_4_;
  local_3b0 = vsubps_avx(_local_4d0,auVar216);
  auVar9 = vshufps_avx(local_3b0,local_3b0,0xaa);
  auVar117 = vmovshdup_avx(local_3b0);
  auVar229 = vmovsldup_avx(local_3b0);
  auVar327._0_8_ =
       CONCAT44(auVar229._4_4_ * fVar219 + auVar117._4_4_ * fVar223 + auVar9._4_4_ * fVar175,
                auVar229._0_4_ * fVar201 + auVar117._0_4_ * fVar222 + auVar9._0_4_ * fVar174);
  auVar327._8_4_ = auVar229._8_4_ * fVar220 + auVar117._8_4_ * fVar224 + auVar9._8_4_ * fVar176;
  auVar327._12_4_ = auVar229._12_4_ * fVar221 + auVar117._12_4_ * fVar150 + auVar9._12_4_ * fVar177;
  local_3c0 = vsubps_avx(_local_4c0,auVar216);
  auVar9 = vshufps_avx(local_3c0,local_3c0,0xaa);
  auVar117 = vmovshdup_avx(local_3c0);
  auVar229 = vmovsldup_avx(local_3c0);
  auVar286._0_4_ = auVar229._0_4_ * fVar201 + auVar117._0_4_ * fVar222 + auVar9._0_4_ * fVar174;
  auVar286._4_4_ = auVar229._4_4_ * fVar219 + auVar117._4_4_ * fVar223 + auVar9._4_4_ * fVar175;
  auVar286._8_4_ = auVar229._8_4_ * fVar220 + auVar117._8_4_ * fVar224 + auVar9._8_4_ * fVar176;
  auVar286._12_4_ = auVar229._12_4_ * fVar221 + auVar117._12_4_ * fVar150 + auVar9._12_4_ * fVar177;
  local_500._0_4_ = (float)local_4c0._0_4_ + (fVar180 + auVar230._0_4_) * 0.33333334;
  local_500._4_4_ = (float)local_4c0._4_4_ + (fVar196 + auVar230._4_4_) * 0.33333334;
  fStack_4f8 = fStack_4b8 + (fVar198 + auVar230._8_4_) * 0.33333334;
  fStack_4f4 = fStack_4b4 + (fVar200 + auVar230._12_4_) * 0.33333334;
  local_3d0 = vsubps_avx(_local_500,auVar216);
  auVar9 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar117 = vmovshdup_avx(local_3d0);
  auVar229 = vmovsldup_avx(local_3d0);
  auVar257._0_4_ = auVar229._0_4_ * fVar201 + auVar117._0_4_ * fVar222 + auVar9._0_4_ * fVar174;
  auVar257._4_4_ = auVar229._4_4_ * fVar219 + auVar117._4_4_ * fVar223 + auVar9._4_4_ * fVar175;
  auVar257._8_4_ = auVar229._8_4_ * fVar220 + auVar117._8_4_ * fVar224 + auVar9._8_4_ * fVar176;
  auVar257._12_4_ = auVar229._12_4_ * fVar221 + auVar117._12_4_ * fVar150 + auVar9._12_4_ * fVar177;
  auVar246._0_4_ = (fVar295 + auVar110._0_4_) * 0.33333334;
  auVar246._4_4_ = (fVar306 + auVar110._4_4_) * 0.33333334;
  auVar246._8_4_ = (fVar307 + auVar110._8_4_) * 0.33333334;
  auVar246._12_4_ = (fVar308 + auVar110._12_4_) * 0.33333334;
  auVar75._4_4_ = fVar197;
  auVar75._0_4_ = fVar195;
  auVar75._8_4_ = fVar199;
  auVar75._12_4_ = fVar294;
  _local_410 = vsubps_avx(auVar75,auVar246);
  local_3e0 = vsubps_avx(_local_410,auVar216);
  auVar9 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar117 = vmovshdup_avx(local_3e0);
  auVar229 = vmovsldup_avx(local_3e0);
  auVar111._0_4_ = auVar229._0_4_ * fVar201 + auVar117._0_4_ * fVar222 + fVar174 * auVar9._0_4_;
  auVar111._4_4_ = auVar229._4_4_ * fVar219 + auVar117._4_4_ * fVar223 + fVar175 * auVar9._4_4_;
  auVar111._8_4_ = auVar229._8_4_ * fVar220 + auVar117._8_4_ * fVar224 + fVar176 * auVar9._8_4_;
  auVar111._12_4_ = auVar229._12_4_ * fVar221 + auVar117._12_4_ * fVar150 + fVar177 * auVar9._12_4_;
  local_3f0 = vsubps_avx(auVar75,auVar216);
  auVar216 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar117 = vmovshdup_avx(local_3f0);
  auVar229 = vmovsldup_avx(local_3f0);
  auVar93._0_4_ = fVar201 * auVar229._0_4_ + fVar222 * auVar117._0_4_ + fVar174 * auVar216._0_4_;
  auVar93._4_4_ = fVar219 * auVar229._4_4_ + fVar223 * auVar117._4_4_ + fVar175 * auVar216._4_4_;
  auVar93._8_4_ = fVar220 * auVar229._8_4_ + fVar224 * auVar117._8_4_ + fVar176 * auVar216._8_4_;
  auVar93._12_4_ = fVar221 * auVar229._12_4_ + fVar150 * auVar117._12_4_ + fVar177 * auVar216._12_4_
  ;
  auVar9 = vmovlhps_avx(auVar311,auVar286);
  auVar298 = vmovlhps_avx(_local_6b0,auVar257);
  auVar10 = vmovlhps_avx(auVar339,auVar111);
  auVar11 = vmovlhps_avx(auVar327,auVar93);
  auVar117 = vminps_avx(auVar9,auVar298);
  auVar229 = vminps_avx(auVar10,auVar11);
  auVar216 = vminps_avx(auVar117,auVar229);
  auVar117 = vmaxps_avx(auVar9,auVar298);
  auVar229 = vmaxps_avx(auVar10,auVar11);
  auVar117 = vmaxps_avx(auVar117,auVar229);
  auVar229 = vshufpd_avx(auVar216,auVar216,3);
  auVar216 = vminps_avx(auVar216,auVar229);
  auVar229 = vshufpd_avx(auVar117,auVar117,3);
  auVar229 = vmaxps_avx(auVar117,auVar229);
  auVar231._8_4_ = 0x7fffffff;
  auVar231._0_8_ = 0x7fffffff7fffffff;
  auVar231._12_4_ = 0x7fffffff;
  auVar117 = vandps_avx(auVar216,auVar231);
  auVar229 = vandps_avx(auVar229,auVar231);
  auVar117 = vmaxps_avx(auVar117,auVar229);
  auVar229 = vmovshdup_avx(auVar117);
  auVar117 = vmaxss_avx(auVar229,auVar117);
  fVar219 = auVar117._0_4_ * 9.536743e-07;
  register0x00001548 = auVar327._0_8_;
  local_4a0 = auVar327._0_8_;
  auVar117 = vshufps_avx(ZEXT416((uint)fVar219),ZEXT416((uint)fVar219),0);
  local_280._16_16_ = auVar117;
  local_280._0_16_ = auVar117;
  auVar94._0_8_ = auVar117._0_8_ ^ 0x8000000080000000;
  auVar94._8_4_ = auVar117._8_4_ ^ 0x80000000;
  auVar94._12_4_ = auVar117._12_4_ ^ 0x80000000;
  local_2a0._16_16_ = auVar94;
  local_2a0._0_16_ = auVar94;
  auVar117 = vshufps_avx(ZEXT416(uVar82),ZEXT416(uVar82),0);
  local_2e0._16_16_ = auVar117;
  local_2e0._0_16_ = auVar117;
  auVar117 = vpshufd_avx(ZEXT416(*(uint *)(prim + lVar84 * 4 + 6)),0);
  local_300._16_16_ = auVar117;
  local_300._0_16_ = auVar117;
  bVar81 = false;
  uVar89 = 0;
  fVar201 = *(float *)(ray + k * 4 + 0x60);
  _local_350 = vsubps_avx(auVar298,auVar9);
  _local_360 = vsubps_avx(auVar10,auVar298);
  _local_370 = vsubps_avx(auVar11,auVar10);
  _local_420 = vsubps_avx(_local_4c0,_local_4b0);
  _local_430 = vsubps_avx(_local_500,_local_4e0);
  _local_440 = vsubps_avx(_local_410,_local_4f0);
  auVar76._4_4_ = fVar197;
  auVar76._0_4_ = fVar195;
  auVar76._8_4_ = fVar199;
  auVar76._12_4_ = fVar294;
  _local_450 = vsubps_avx(auVar76,_local_4d0);
  _local_6b0 = ZEXT816(0x3f80000000000000);
  local_400 = _local_6b0;
  do {
    auVar117 = vshufps_avx(_local_6b0,_local_6b0,0x50);
    auVar349._8_4_ = 0x3f800000;
    auVar349._0_8_ = &DAT_3f8000003f800000;
    auVar349._12_4_ = 0x3f800000;
    auVar354._16_4_ = 0x3f800000;
    auVar354._0_16_ = auVar349;
    auVar354._20_4_ = 0x3f800000;
    auVar354._24_4_ = 0x3f800000;
    auVar354._28_4_ = 0x3f800000;
    auVar229 = vsubps_avx(auVar349,auVar117);
    fVar220 = auVar117._0_4_;
    fVar222 = auVar117._4_4_;
    fVar224 = auVar117._8_4_;
    fVar174 = auVar117._12_4_;
    fVar221 = auVar229._0_4_;
    fVar223 = auVar229._4_4_;
    fVar150 = auVar229._8_4_;
    fVar175 = auVar229._12_4_;
    auVar135._0_4_ = auVar286._0_4_ * fVar220 + auVar311._0_4_ * fVar221;
    auVar135._4_4_ = auVar286._4_4_ * fVar222 + auVar311._4_4_ * fVar223;
    auVar135._8_4_ = auVar286._0_4_ * fVar224 + auVar311._0_4_ * fVar150;
    auVar135._12_4_ = auVar286._4_4_ * fVar174 + auVar311._4_4_ * fVar175;
    auVar112._0_4_ = auVar257._0_4_ * fVar220 + fVar178 * fVar221;
    auVar112._4_4_ = auVar257._4_4_ * fVar222 + fVar179 * fVar223;
    auVar112._8_4_ = auVar257._0_4_ * fVar224 + fVar178 * fVar150;
    auVar112._12_4_ = auVar257._4_4_ * fVar174 + fVar179 * fVar175;
    auVar183._0_4_ = auVar111._0_4_ * fVar220 + auVar339._0_4_ * fVar221;
    auVar183._4_4_ = auVar111._4_4_ * fVar222 + auVar339._4_4_ * fVar223;
    auVar183._8_4_ = auVar111._0_4_ * fVar224 + auVar339._0_4_ * fVar150;
    auVar183._12_4_ = auVar111._4_4_ * fVar174 + auVar339._4_4_ * fVar175;
    auVar154._0_4_ = auVar93._0_4_ * fVar220 + local_4a0._0_4_ * fVar221;
    auVar154._4_4_ = auVar93._4_4_ * fVar222 + local_4a0._4_4_ * fVar223;
    auVar154._8_4_ = auVar93._0_4_ * fVar224 + local_4a0._8_4_ * fVar150;
    auVar154._12_4_ = auVar93._4_4_ * fVar174 + local_4a0._12_4_ * fVar175;
    auVar117 = vmovshdup_avx(local_400);
    auVar229 = vshufps_avx(local_400,local_400,0);
    auVar268._16_16_ = auVar229;
    auVar268._0_16_ = auVar229;
    auVar216 = vshufps_avx(local_400,local_400,0x55);
    auVar102._16_16_ = auVar216;
    auVar102._0_16_ = auVar216;
    auVar97 = vsubps_avx(auVar102,auVar268);
    auVar216 = vshufps_avx(auVar135,auVar135,0);
    auVar162 = vshufps_avx(auVar135,auVar135,0x55);
    auVar116 = vshufps_avx(auVar112,auVar112,0);
    auVar161 = vshufps_avx(auVar112,auVar112,0x55);
    auVar95 = vshufps_avx(auVar183,auVar183,0);
    auVar136 = vshufps_avx(auVar183,auVar183,0x55);
    auVar92 = vshufps_avx(auVar154,auVar154,0);
    auVar108 = vshufps_avx(auVar154,auVar154,0x55);
    auVar117 = ZEXT416((uint)((auVar117._0_4_ - local_400._0_4_) * 0.04761905));
    auVar117 = vshufps_avx(auVar117,auVar117,0);
    auVar284._0_4_ = auVar229._0_4_ + auVar97._0_4_ * 0.0;
    auVar284._4_4_ = auVar229._4_4_ + auVar97._4_4_ * 0.14285715;
    auVar284._8_4_ = auVar229._8_4_ + auVar97._8_4_ * 0.2857143;
    auVar284._12_4_ = auVar229._12_4_ + auVar97._12_4_ * 0.42857146;
    auVar284._16_4_ = auVar229._0_4_ + auVar97._16_4_ * 0.5714286;
    auVar284._20_4_ = auVar229._4_4_ + auVar97._20_4_ * 0.71428573;
    auVar284._24_4_ = auVar229._8_4_ + auVar97._24_4_ * 0.8571429;
    auVar284._28_4_ = auVar229._12_4_ + auVar97._28_4_;
    auVar20 = vsubps_avx(auVar354,auVar284);
    fVar200 = auVar116._0_4_;
    fVar306 = auVar116._4_4_;
    fVar316 = auVar116._8_4_;
    fVar333 = auVar116._12_4_;
    fVar220 = auVar20._0_4_;
    fVar224 = auVar20._4_4_;
    fVar176 = auVar20._8_4_;
    fVar198 = auVar20._12_4_;
    fVar335 = auVar216._12_4_;
    fVar307 = auVar20._16_4_;
    fVar308 = auVar20._20_4_;
    fVar309 = auVar20._24_4_;
    fVar347 = auVar161._0_4_;
    fVar240 = auVar161._4_4_;
    fVar241 = auVar161._8_4_;
    fVar326 = auVar161._12_4_;
    local_5e0 = auVar162._0_4_;
    fStack_5dc = auVar162._4_4_;
    fStack_5d8 = auVar162._8_4_;
    fStack_5d4 = auVar162._12_4_;
    fVar221 = auVar95._0_4_;
    fVar223 = auVar95._4_4_;
    fVar174 = auVar95._8_4_;
    fVar177 = auVar95._12_4_;
    fVar295 = auVar284._0_4_ * fVar221 + fVar200 * fVar220;
    fVar314 = auVar284._4_4_ * fVar223 + fVar306 * fVar224;
    fVar318 = auVar284._8_4_ * fVar174 + fVar316 * fVar176;
    fVar334 = auVar284._12_4_ * fVar177 + fVar333 * fVar198;
    fVar337 = auVar284._16_4_ * fVar221 + fVar200 * fVar307;
    fVar343 = auVar284._20_4_ * fVar223 + fVar306 * fVar308;
    fVar345 = auVar284._24_4_ * fVar174 + fVar316 * fVar309;
    fVar222 = auVar136._0_4_;
    fVar150 = auVar136._4_4_;
    fVar175 = auVar136._8_4_;
    fVar180 = auVar136._12_4_;
    fVar310 = auVar284._0_4_ * fVar222 + fVar347 * fVar220;
    fVar315 = auVar284._4_4_ * fVar150 + fVar240 * fVar224;
    fVar317 = auVar284._8_4_ * fVar175 + fVar241 * fVar176;
    fVar319 = auVar284._12_4_ * fVar180 + fVar326 * fVar198;
    fVar320 = auVar284._16_4_ * fVar222 + fVar347 * fVar307;
    fVar322 = auVar284._20_4_ * fVar150 + fVar240 * fVar308;
    fVar324 = auVar284._24_4_ * fVar175 + fVar241 * fVar309;
    auVar229 = vshufps_avx(auVar135,auVar135,0xaa);
    auVar162 = vshufps_avx(auVar135,auVar135,0xff);
    fVar196 = fVar177 + 0.0;
    auVar116 = vshufps_avx(auVar112,auVar112,0xaa);
    auVar161 = vshufps_avx(auVar112,auVar112,0xff);
    auVar103._0_4_ =
         fVar220 * (fVar200 * auVar284._0_4_ + auVar216._0_4_ * fVar220) + auVar284._0_4_ * fVar295;
    auVar103._4_4_ =
         fVar224 * (fVar306 * auVar284._4_4_ + auVar216._4_4_ * fVar224) + auVar284._4_4_ * fVar314;
    auVar103._8_4_ =
         fVar176 * (fVar316 * auVar284._8_4_ + auVar216._8_4_ * fVar176) + auVar284._8_4_ * fVar318;
    auVar103._12_4_ =
         fVar198 * (fVar333 * auVar284._12_4_ + fVar335 * fVar198) + auVar284._12_4_ * fVar334;
    auVar103._16_4_ =
         fVar307 * (fVar200 * auVar284._16_4_ + auVar216._0_4_ * fVar307) +
         auVar284._16_4_ * fVar337;
    auVar103._20_4_ =
         fVar308 * (fVar306 * auVar284._20_4_ + auVar216._4_4_ * fVar308) +
         auVar284._20_4_ * fVar343;
    auVar103._24_4_ =
         fVar309 * (fVar316 * auVar284._24_4_ + auVar216._8_4_ * fVar309) +
         auVar284._24_4_ * fVar345;
    auVar103._28_4_ = fVar335 + 1.0 + fVar180;
    auVar170._0_4_ =
         fVar220 * (fVar347 * auVar284._0_4_ + fVar220 * local_5e0) + auVar284._0_4_ * fVar310;
    auVar170._4_4_ =
         fVar224 * (fVar240 * auVar284._4_4_ + fVar224 * fStack_5dc) + auVar284._4_4_ * fVar315;
    auVar170._8_4_ =
         fVar176 * (fVar241 * auVar284._8_4_ + fVar176 * fStack_5d8) + auVar284._8_4_ * fVar317;
    auVar170._12_4_ =
         fVar198 * (fVar326 * auVar284._12_4_ + fVar198 * fStack_5d4) + auVar284._12_4_ * fVar319;
    auVar170._16_4_ =
         fVar307 * (fVar347 * auVar284._16_4_ + fVar307 * local_5e0) + auVar284._16_4_ * fVar320;
    auVar170._20_4_ =
         fVar308 * (fVar240 * auVar284._20_4_ + fVar308 * fStack_5dc) + auVar284._20_4_ * fVar322;
    auVar170._24_4_ =
         fVar309 * (fVar241 * auVar284._24_4_ + fVar309 * fStack_5d8) + auVar284._24_4_ * fVar324;
    auVar170._28_4_ = fVar335 + 1.0 + fVar180;
    auVar192._0_4_ =
         fVar220 * fVar295 + auVar284._0_4_ * (auVar92._0_4_ * auVar284._0_4_ + fVar220 * fVar221);
    auVar192._4_4_ =
         fVar224 * fVar314 + auVar284._4_4_ * (auVar92._4_4_ * auVar284._4_4_ + fVar224 * fVar223);
    auVar192._8_4_ =
         fVar176 * fVar318 + auVar284._8_4_ * (auVar92._8_4_ * auVar284._8_4_ + fVar176 * fVar174);
    auVar192._12_4_ =
         fVar198 * fVar334 +
         auVar284._12_4_ * (auVar92._12_4_ * auVar284._12_4_ + fVar198 * fVar177);
    auVar192._16_4_ =
         fVar307 * fVar337 + auVar284._16_4_ * (auVar92._0_4_ * auVar284._16_4_ + fVar307 * fVar221)
    ;
    auVar192._20_4_ =
         fVar308 * fVar343 + auVar284._20_4_ * (auVar92._4_4_ * auVar284._20_4_ + fVar308 * fVar223)
    ;
    auVar192._24_4_ =
         fVar309 * fVar345 + auVar284._24_4_ * (auVar92._8_4_ * auVar284._24_4_ + fVar309 * fVar174)
    ;
    auVar192._28_4_ = fVar180 + fVar196;
    auVar293._0_4_ =
         fVar220 * fVar310 + auVar284._0_4_ * (auVar108._0_4_ * auVar284._0_4_ + fVar220 * fVar222);
    auVar293._4_4_ =
         fVar224 * fVar315 + auVar284._4_4_ * (auVar108._4_4_ * auVar284._4_4_ + fVar224 * fVar150);
    auVar293._8_4_ =
         fVar176 * fVar317 + auVar284._8_4_ * (auVar108._8_4_ * auVar284._8_4_ + fVar176 * fVar175);
    auVar293._12_4_ =
         fVar198 * fVar319 +
         auVar284._12_4_ * (auVar108._12_4_ * auVar284._12_4_ + fVar198 * fVar180);
    auVar293._16_4_ =
         fVar307 * fVar320 +
         auVar284._16_4_ * (auVar108._0_4_ * auVar284._16_4_ + fVar307 * fVar222);
    auVar293._20_4_ =
         fVar308 * fVar322 +
         auVar284._20_4_ * (auVar108._4_4_ * auVar284._20_4_ + fVar308 * fVar150);
    auVar293._24_4_ =
         fVar309 * fVar324 +
         auVar284._24_4_ * (auVar108._8_4_ * auVar284._24_4_ + fVar309 * fVar175);
    auVar293._28_4_ = fVar196 + fVar180 + 0.0;
    local_1c0._0_4_ = fVar220 * auVar103._0_4_ + auVar284._0_4_ * auVar192._0_4_;
    local_1c0._4_4_ = fVar224 * auVar103._4_4_ + auVar284._4_4_ * auVar192._4_4_;
    local_1c0._8_4_ = fVar176 * auVar103._8_4_ + auVar284._8_4_ * auVar192._8_4_;
    local_1c0._12_4_ = fVar198 * auVar103._12_4_ + auVar284._12_4_ * auVar192._12_4_;
    local_1c0._16_4_ = fVar307 * auVar103._16_4_ + auVar284._16_4_ * auVar192._16_4_;
    local_1c0._20_4_ = fVar308 * auVar103._20_4_ + auVar284._20_4_ * auVar192._20_4_;
    local_1c0._24_4_ = fVar309 * auVar103._24_4_ + auVar284._24_4_ * auVar192._24_4_;
    local_1c0._28_4_ = fVar335 + fVar333 + fVar180 + 0.0;
    local_1e0._0_4_ = fVar220 * auVar170._0_4_ + auVar284._0_4_ * auVar293._0_4_;
    local_1e0._4_4_ = fVar224 * auVar170._4_4_ + auVar284._4_4_ * auVar293._4_4_;
    local_1e0._8_4_ = fVar176 * auVar170._8_4_ + auVar284._8_4_ * auVar293._8_4_;
    local_1e0._12_4_ = fVar198 * auVar170._12_4_ + auVar284._12_4_ * auVar293._12_4_;
    local_1e0._16_4_ = fVar307 * auVar170._16_4_ + auVar284._16_4_ * auVar293._16_4_;
    local_1e0._20_4_ = fVar308 * auVar170._20_4_ + auVar284._20_4_ * auVar293._20_4_;
    local_1e0._24_4_ = fVar309 * auVar170._24_4_ + auVar284._24_4_ * auVar293._24_4_;
    local_1e0._28_4_ = fVar335 + fVar333 + fVar196;
    auVar21 = vsubps_avx(auVar192,auVar103);
    auVar97 = vsubps_avx(auVar293,auVar170);
    local_640 = auVar117._0_4_;
    fStack_63c = auVar117._4_4_;
    fStack_638 = auVar117._8_4_;
    fStack_634 = auVar117._12_4_;
    local_220 = local_640 * auVar21._0_4_ * 3.0;
    fStack_21c = fStack_63c * auVar21._4_4_ * 3.0;
    auVar29._4_4_ = fStack_21c;
    auVar29._0_4_ = local_220;
    fStack_218 = fStack_638 * auVar21._8_4_ * 3.0;
    auVar29._8_4_ = fStack_218;
    fStack_214 = fStack_634 * auVar21._12_4_ * 3.0;
    auVar29._12_4_ = fStack_214;
    fStack_210 = local_640 * auVar21._16_4_ * 3.0;
    auVar29._16_4_ = fStack_210;
    fStack_20c = fStack_63c * auVar21._20_4_ * 3.0;
    auVar29._20_4_ = fStack_20c;
    fStack_208 = fStack_638 * auVar21._24_4_ * 3.0;
    auVar29._24_4_ = fStack_208;
    auVar29._28_4_ = auVar21._28_4_;
    fVar314 = local_640 * auVar97._0_4_ * 3.0;
    fVar316 = fStack_63c * auVar97._4_4_ * 3.0;
    auVar30._4_4_ = fVar316;
    auVar30._0_4_ = fVar314;
    fVar318 = fStack_638 * auVar97._8_4_ * 3.0;
    auVar30._8_4_ = fVar318;
    fVar333 = fStack_634 * auVar97._12_4_ * 3.0;
    auVar30._12_4_ = fVar333;
    fVar334 = local_640 * auVar97._16_4_ * 3.0;
    auVar30._16_4_ = fVar334;
    fVar337 = fStack_63c * auVar97._20_4_ * 3.0;
    auVar30._20_4_ = fVar337;
    fVar343 = fStack_638 * auVar97._24_4_ * 3.0;
    auVar30._24_4_ = fVar343;
    auVar30._28_4_ = auVar192._28_4_;
    auVar19 = vsubps_avx(local_1c0,auVar29);
    auVar97 = vperm2f128_avx(auVar19,auVar19,1);
    auVar97 = vshufps_avx(auVar97,auVar19,0x30);
    auVar97 = vshufps_avx(auVar19,auVar97,0x29);
    auVar22 = vsubps_avx(local_1e0,auVar30);
    auVar19 = vperm2f128_avx(auVar22,auVar22,1);
    auVar19 = vshufps_avx(auVar19,auVar22,0x30);
    auVar23 = vshufps_avx(auVar22,auVar19,0x29);
    fVar338 = auVar116._0_4_;
    fVar344 = auVar116._4_4_;
    fVar346 = auVar116._8_4_;
    fVar221 = auVar161._0_4_;
    fVar150 = auVar161._4_4_;
    fVar177 = auVar161._8_4_;
    fVar200 = auVar161._12_4_;
    fVar336 = auVar162._12_4_;
    auVar117 = vshufps_avx(auVar183,auVar183,0xaa);
    fVar222 = auVar117._0_4_;
    fVar174 = auVar117._4_4_;
    fVar180 = auVar117._8_4_;
    fVar295 = auVar117._12_4_;
    fVar319 = auVar284._0_4_ * fVar222 + fVar338 * fVar220;
    fVar320 = auVar284._4_4_ * fVar174 + fVar344 * fVar224;
    fVar322 = auVar284._8_4_ * fVar180 + fVar346 * fVar176;
    fVar324 = auVar284._12_4_ * fVar295 + auVar116._12_4_ * fVar198;
    fVar321 = auVar284._16_4_ * fVar222 + fVar338 * fVar307;
    fVar323 = auVar284._20_4_ * fVar174 + fVar344 * fVar308;
    fVar325 = auVar284._24_4_ * fVar180 + fVar346 * fVar309;
    fVar326 = fVar336 + fVar335 + fVar326;
    auVar117 = vshufps_avx(auVar183,auVar183,0xff);
    fVar223 = auVar117._0_4_;
    fVar175 = auVar117._4_4_;
    fVar196 = auVar117._8_4_;
    fVar306 = auVar117._12_4_;
    fVar345 = auVar284._0_4_ * fVar223 + fVar220 * fVar221;
    fVar347 = auVar284._4_4_ * fVar175 + fVar224 * fVar150;
    fVar310 = auVar284._8_4_ * fVar196 + fVar176 * fVar177;
    fVar240 = auVar284._12_4_ * fVar306 + fVar198 * fVar200;
    fVar315 = auVar284._16_4_ * fVar223 + fVar307 * fVar221;
    fVar241 = auVar284._20_4_ * fVar175 + fVar308 * fVar150;
    fVar317 = auVar284._24_4_ * fVar196 + fVar309 * fVar177;
    auVar117 = vshufps_avx(auVar154,auVar154,0xaa);
    auVar216 = vshufps_avx(auVar154,auVar154,0xff);
    fVar335 = auVar216._12_4_;
    auVar104._0_4_ =
         auVar284._0_4_ * fVar319 + fVar220 * (fVar338 * auVar284._0_4_ + auVar229._0_4_ * fVar220);
    auVar104._4_4_ =
         auVar284._4_4_ * fVar320 + fVar224 * (fVar344 * auVar284._4_4_ + auVar229._4_4_ * fVar224);
    auVar104._8_4_ =
         auVar284._8_4_ * fVar322 + fVar176 * (fVar346 * auVar284._8_4_ + auVar229._8_4_ * fVar176);
    auVar104._12_4_ =
         auVar284._12_4_ * fVar324 +
         fVar198 * (auVar116._12_4_ * auVar284._12_4_ + auVar229._12_4_ * fVar198);
    auVar104._16_4_ =
         auVar284._16_4_ * fVar321 +
         fVar307 * (fVar338 * auVar284._16_4_ + auVar229._0_4_ * fVar307);
    auVar104._20_4_ =
         auVar284._20_4_ * fVar323 +
         fVar308 * (fVar344 * auVar284._20_4_ + auVar229._4_4_ * fVar308);
    auVar104._24_4_ =
         auVar284._24_4_ * fVar325 +
         fVar309 * (fVar346 * auVar284._24_4_ + auVar229._8_4_ * fVar309);
    auVar104._28_4_ = fVar335 + auVar22._28_4_ + auVar19._28_4_;
    auVar332._0_4_ =
         auVar284._0_4_ * fVar345 + fVar220 * (auVar284._0_4_ * fVar221 + auVar162._0_4_ * fVar220);
    auVar332._4_4_ =
         auVar284._4_4_ * fVar347 + fVar224 * (auVar284._4_4_ * fVar150 + auVar162._4_4_ * fVar224);
    auVar332._8_4_ =
         auVar284._8_4_ * fVar310 + fVar176 * (auVar284._8_4_ * fVar177 + auVar162._8_4_ * fVar176);
    auVar332._12_4_ =
         auVar284._12_4_ * fVar240 + fVar198 * (auVar284._12_4_ * fVar200 + fVar336 * fVar198);
    auVar332._16_4_ =
         auVar284._16_4_ * fVar315 +
         fVar307 * (auVar284._16_4_ * fVar221 + auVar162._0_4_ * fVar307);
    auVar332._20_4_ =
         auVar284._20_4_ * fVar241 +
         fVar308 * (auVar284._20_4_ * fVar150 + auVar162._4_4_ * fVar308);
    auVar332._24_4_ =
         auVar284._24_4_ * fVar317 +
         fVar309 * (auVar284._24_4_ * fVar177 + auVar162._8_4_ * fVar309);
    auVar332._28_4_ = fVar335 + auVar19._28_4_ + auVar192._28_4_;
    auVar19 = vperm2f128_avx(local_1c0,local_1c0,1);
    auVar19 = vshufps_avx(auVar19,local_1c0,0x30);
    auVar24 = vshufps_avx(local_1c0,auVar19,0x29);
    auVar193._0_4_ =
         fVar220 * fVar319 + auVar284._0_4_ * (auVar117._0_4_ * auVar284._0_4_ + fVar220 * fVar222);
    auVar193._4_4_ =
         fVar224 * fVar320 + auVar284._4_4_ * (auVar117._4_4_ * auVar284._4_4_ + fVar224 * fVar174);
    auVar193._8_4_ =
         fVar176 * fVar322 + auVar284._8_4_ * (auVar117._8_4_ * auVar284._8_4_ + fVar176 * fVar180);
    auVar193._12_4_ =
         fVar198 * fVar324 +
         auVar284._12_4_ * (auVar117._12_4_ * auVar284._12_4_ + fVar198 * fVar295);
    auVar193._16_4_ =
         fVar307 * fVar321 +
         auVar284._16_4_ * (auVar117._0_4_ * auVar284._16_4_ + fVar307 * fVar222);
    auVar193._20_4_ =
         fVar308 * fVar323 +
         auVar284._20_4_ * (auVar117._4_4_ * auVar284._20_4_ + fVar308 * fVar174);
    auVar193._24_4_ =
         fVar309 * fVar325 +
         auVar284._24_4_ * (auVar117._8_4_ * auVar284._24_4_ + fVar309 * fVar180);
    auVar193._28_4_ = fVar326 + auVar117._12_4_ + fVar295;
    auVar239._0_4_ =
         fVar220 * fVar345 + auVar284._0_4_ * (auVar216._0_4_ * auVar284._0_4_ + fVar220 * fVar223);
    auVar239._4_4_ =
         fVar224 * fVar347 + auVar284._4_4_ * (auVar216._4_4_ * auVar284._4_4_ + fVar224 * fVar175);
    auVar239._8_4_ =
         fVar176 * fVar310 + auVar284._8_4_ * (auVar216._8_4_ * auVar284._8_4_ + fVar176 * fVar196);
    auVar239._12_4_ =
         fVar198 * fVar240 + auVar284._12_4_ * (fVar335 * auVar284._12_4_ + fVar198 * fVar306);
    auVar239._16_4_ =
         fVar307 * fVar315 +
         auVar284._16_4_ * (auVar216._0_4_ * auVar284._16_4_ + fVar307 * fVar223);
    auVar239._20_4_ =
         fVar308 * fVar241 +
         auVar284._20_4_ * (auVar216._4_4_ * auVar284._20_4_ + fVar308 * fVar175);
    auVar239._24_4_ =
         fVar309 * fVar317 +
         auVar284._24_4_ * (auVar216._8_4_ * auVar284._24_4_ + fVar309 * fVar196);
    auVar239._28_4_ = fVar336 + fVar200 + fVar335 + fVar306;
    auVar253._0_4_ = fVar220 * auVar104._0_4_ + auVar284._0_4_ * auVar193._0_4_;
    auVar253._4_4_ = fVar224 * auVar104._4_4_ + auVar284._4_4_ * auVar193._4_4_;
    auVar253._8_4_ = fVar176 * auVar104._8_4_ + auVar284._8_4_ * auVar193._8_4_;
    auVar253._12_4_ = fVar198 * auVar104._12_4_ + auVar284._12_4_ * auVar193._12_4_;
    auVar253._16_4_ = fVar307 * auVar104._16_4_ + auVar284._16_4_ * auVar193._16_4_;
    auVar253._20_4_ = fVar308 * auVar104._20_4_ + auVar284._20_4_ * auVar193._20_4_;
    auVar253._24_4_ = fVar309 * auVar104._24_4_ + auVar284._24_4_ * auVar193._24_4_;
    auVar253._28_4_ = fVar326 + fVar335 + fVar306;
    auVar269._0_4_ = fVar220 * auVar332._0_4_ + auVar284._0_4_ * auVar239._0_4_;
    auVar269._4_4_ = fVar224 * auVar332._4_4_ + auVar284._4_4_ * auVar239._4_4_;
    auVar269._8_4_ = fVar176 * auVar332._8_4_ + auVar284._8_4_ * auVar239._8_4_;
    auVar269._12_4_ = fVar198 * auVar332._12_4_ + auVar284._12_4_ * auVar239._12_4_;
    auVar269._16_4_ = fVar307 * auVar332._16_4_ + auVar284._16_4_ * auVar239._16_4_;
    auVar269._20_4_ = fVar308 * auVar332._20_4_ + auVar284._20_4_ * auVar239._20_4_;
    auVar269._24_4_ = fVar309 * auVar332._24_4_ + auVar284._24_4_ * auVar239._24_4_;
    auVar269._28_4_ = auVar20._28_4_ + auVar284._28_4_;
    auVar19 = vsubps_avx(auVar193,auVar104);
    auVar20 = vsubps_avx(auVar239,auVar332);
    local_240 = local_640 * auVar19._0_4_ * 3.0;
    fStack_23c = fStack_63c * auVar19._4_4_ * 3.0;
    auVar31._4_4_ = fStack_23c;
    auVar31._0_4_ = local_240;
    fStack_238 = fStack_638 * auVar19._8_4_ * 3.0;
    auVar31._8_4_ = fStack_238;
    fStack_234 = fStack_634 * auVar19._12_4_ * 3.0;
    auVar31._12_4_ = fStack_234;
    fStack_230 = local_640 * auVar19._16_4_ * 3.0;
    auVar31._16_4_ = fStack_230;
    fStack_22c = fStack_63c * auVar19._20_4_ * 3.0;
    auVar31._20_4_ = fStack_22c;
    fStack_228 = fStack_638 * auVar19._24_4_ * 3.0;
    auVar31._24_4_ = fStack_228;
    auVar31._28_4_ = auVar239._28_4_;
    local_260 = local_640 * auVar20._0_4_ * 3.0;
    fStack_25c = fStack_63c * auVar20._4_4_ * 3.0;
    auVar32._4_4_ = fStack_25c;
    auVar32._0_4_ = local_260;
    fStack_258 = fStack_638 * auVar20._8_4_ * 3.0;
    auVar32._8_4_ = fStack_258;
    fStack_254 = fStack_634 * auVar20._12_4_ * 3.0;
    auVar32._12_4_ = fStack_254;
    local_640 = local_640 * auVar20._16_4_ * 3.0;
    auVar32._16_4_ = local_640;
    fStack_63c = fStack_63c * auVar20._20_4_ * 3.0;
    auVar32._20_4_ = fStack_63c;
    fStack_638 = fStack_638 * auVar20._24_4_ * 3.0;
    auVar32._24_4_ = fStack_638;
    auVar32._28_4_ = fStack_634;
    auVar19 = vperm2f128_avx(auVar253,auVar253,1);
    auVar19 = vshufps_avx(auVar19,auVar253,0x30);
    auVar25 = vshufps_avx(auVar253,auVar19,0x29);
    auVar20 = vsubps_avx(auVar253,auVar31);
    auVar19 = vperm2f128_avx(auVar20,auVar20,1);
    auVar19 = vshufps_avx(auVar19,auVar20,0x30);
    auVar26 = vshufps_avx(auVar20,auVar19,0x29);
    auVar20 = vsubps_avx(auVar269,auVar32);
    auVar19 = vperm2f128_avx(auVar20,auVar20,1);
    auVar19 = vshufps_avx(auVar19,auVar20,0x30);
    auVar27 = vshufps_avx(auVar20,auVar19,0x29);
    auVar22 = vsubps_avx(auVar253,local_1c0);
    auVar98 = vsubps_avx(auVar25,auVar24);
    fVar220 = auVar98._0_4_ + auVar22._0_4_;
    fVar221 = auVar98._4_4_ + auVar22._4_4_;
    fVar222 = auVar98._8_4_ + auVar22._8_4_;
    fVar223 = auVar98._12_4_ + auVar22._12_4_;
    fVar224 = auVar98._16_4_ + auVar22._16_4_;
    fVar150 = auVar98._20_4_ + auVar22._20_4_;
    fVar174 = auVar98._24_4_ + auVar22._24_4_;
    auVar20 = vperm2f128_avx(local_1e0,local_1e0,1);
    auVar20 = vshufps_avx(auVar20,local_1e0,0x30);
    local_200 = vshufps_avx(local_1e0,auVar20,0x29);
    auVar20 = vperm2f128_avx(auVar269,auVar269,1);
    auVar20 = vshufps_avx(auVar20,auVar269,0x30);
    auVar28 = vshufps_avx(auVar269,auVar20,0x29);
    auVar20 = vsubps_avx(auVar269,local_1e0);
    auVar99 = vsubps_avx(auVar28,local_200);
    fVar175 = auVar20._0_4_ + auVar99._0_4_;
    fVar176 = auVar20._4_4_ + auVar99._4_4_;
    fVar177 = auVar20._8_4_ + auVar99._8_4_;
    fVar180 = auVar20._12_4_ + auVar99._12_4_;
    fVar196 = auVar20._16_4_ + auVar99._16_4_;
    fVar198 = auVar20._20_4_ + auVar99._20_4_;
    fVar200 = auVar20._24_4_ + auVar99._24_4_;
    fVar295 = auVar20._28_4_;
    auVar33._4_4_ = local_1e0._4_4_ * fVar221;
    auVar33._0_4_ = local_1e0._0_4_ * fVar220;
    auVar33._8_4_ = local_1e0._8_4_ * fVar222;
    auVar33._12_4_ = local_1e0._12_4_ * fVar223;
    auVar33._16_4_ = local_1e0._16_4_ * fVar224;
    auVar33._20_4_ = local_1e0._20_4_ * fVar150;
    auVar33._24_4_ = local_1e0._24_4_ * fVar174;
    auVar33._28_4_ = fVar295;
    auVar34._4_4_ = fVar176 * local_1c0._4_4_;
    auVar34._0_4_ = fVar175 * local_1c0._0_4_;
    auVar34._8_4_ = fVar177 * local_1c0._8_4_;
    auVar34._12_4_ = fVar180 * local_1c0._12_4_;
    auVar34._16_4_ = fVar196 * local_1c0._16_4_;
    auVar34._20_4_ = fVar198 * local_1c0._20_4_;
    auVar34._24_4_ = fVar200 * local_1c0._24_4_;
    auVar34._28_4_ = auVar19._28_4_;
    auVar20 = vsubps_avx(auVar33,auVar34);
    local_220 = local_1c0._0_4_ + local_220;
    fStack_21c = local_1c0._4_4_ + fStack_21c;
    fStack_218 = local_1c0._8_4_ + fStack_218;
    fStack_214 = local_1c0._12_4_ + fStack_214;
    fStack_210 = local_1c0._16_4_ + fStack_210;
    fStack_20c = local_1c0._20_4_ + fStack_20c;
    fStack_208 = local_1c0._24_4_ + fStack_208;
    fStack_204 = local_1c0._28_4_ + auVar21._28_4_;
    fVar314 = local_1e0._0_4_ + fVar314;
    fVar316 = local_1e0._4_4_ + fVar316;
    fVar318 = local_1e0._8_4_ + fVar318;
    fVar333 = local_1e0._12_4_ + fVar333;
    fVar334 = local_1e0._16_4_ + fVar334;
    fVar337 = local_1e0._20_4_ + fVar337;
    fVar343 = local_1e0._24_4_ + fVar343;
    auVar35._4_4_ = fVar316 * fVar221;
    auVar35._0_4_ = fVar314 * fVar220;
    auVar35._8_4_ = fVar318 * fVar222;
    auVar35._12_4_ = fVar333 * fVar223;
    auVar35._16_4_ = fVar334 * fVar224;
    auVar35._20_4_ = fVar337 * fVar150;
    auVar35._24_4_ = fVar343 * fVar174;
    auVar35._28_4_ = fVar295;
    auVar36._4_4_ = fVar176 * fStack_21c;
    auVar36._0_4_ = fVar175 * local_220;
    auVar36._8_4_ = fVar177 * fStack_218;
    auVar36._12_4_ = fVar180 * fStack_214;
    auVar36._16_4_ = fVar196 * fStack_210;
    auVar36._20_4_ = fVar198 * fStack_20c;
    auVar36._24_4_ = fVar200 * fStack_208;
    auVar36._28_4_ = fStack_204;
    auVar21 = vsubps_avx(auVar35,auVar36);
    auVar37._4_4_ = auVar23._4_4_ * fVar221;
    auVar37._0_4_ = auVar23._0_4_ * fVar220;
    auVar37._8_4_ = auVar23._8_4_ * fVar222;
    auVar37._12_4_ = auVar23._12_4_ * fVar223;
    auVar37._16_4_ = auVar23._16_4_ * fVar224;
    auVar37._20_4_ = auVar23._20_4_ * fVar150;
    auVar37._24_4_ = auVar23._24_4_ * fVar174;
    auVar37._28_4_ = fVar295;
    local_5e0 = auVar97._0_4_;
    fStack_5dc = auVar97._4_4_;
    fStack_5d8 = auVar97._8_4_;
    fStack_5d4 = auVar97._12_4_;
    fStack_5d0 = auVar97._16_4_;
    fStack_5cc = auVar97._20_4_;
    fStack_5c8 = auVar97._24_4_;
    auVar38._4_4_ = fVar176 * fStack_5dc;
    auVar38._0_4_ = fVar175 * local_5e0;
    auVar38._8_4_ = fVar177 * fStack_5d8;
    auVar38._12_4_ = fVar180 * fStack_5d4;
    auVar38._16_4_ = fVar196 * fStack_5d0;
    auVar38._20_4_ = fVar198 * fStack_5cc;
    auVar38._24_4_ = fVar200 * fStack_5c8;
    auVar38._28_4_ = 0x40400000;
    auVar100 = vsubps_avx(auVar37,auVar38);
    auVar39._4_4_ = local_200._4_4_ * fVar221;
    auVar39._0_4_ = local_200._0_4_ * fVar220;
    auVar39._8_4_ = local_200._8_4_ * fVar222;
    auVar39._12_4_ = local_200._12_4_ * fVar223;
    auVar39._16_4_ = local_200._16_4_ * fVar224;
    auVar39._20_4_ = local_200._20_4_ * fVar150;
    auVar39._24_4_ = local_200._24_4_ * fVar174;
    auVar39._28_4_ = fVar295;
    auVar40._4_4_ = auVar24._4_4_ * fVar176;
    auVar40._0_4_ = auVar24._0_4_ * fVar175;
    auVar40._8_4_ = auVar24._8_4_ * fVar177;
    auVar40._12_4_ = auVar24._12_4_ * fVar180;
    auVar40._16_4_ = auVar24._16_4_ * fVar196;
    auVar40._20_4_ = auVar24._20_4_ * fVar198;
    auVar40._24_4_ = auVar24._24_4_ * fVar200;
    auVar40._28_4_ = local_200._28_4_;
    auVar126 = vsubps_avx(auVar39,auVar40);
    auVar41._4_4_ = auVar269._4_4_ * fVar221;
    auVar41._0_4_ = auVar269._0_4_ * fVar220;
    auVar41._8_4_ = auVar269._8_4_ * fVar222;
    auVar41._12_4_ = auVar269._12_4_ * fVar223;
    auVar41._16_4_ = auVar269._16_4_ * fVar224;
    auVar41._20_4_ = auVar269._20_4_ * fVar150;
    auVar41._24_4_ = auVar269._24_4_ * fVar174;
    auVar41._28_4_ = fVar295;
    auVar42._4_4_ = fVar176 * auVar253._4_4_;
    auVar42._0_4_ = fVar175 * auVar253._0_4_;
    auVar42._8_4_ = fVar177 * auVar253._8_4_;
    auVar42._12_4_ = fVar180 * auVar253._12_4_;
    auVar42._16_4_ = fVar196 * auVar253._16_4_;
    auVar42._20_4_ = fVar198 * auVar253._20_4_;
    auVar42._24_4_ = fVar200 * auVar253._24_4_;
    auVar42._28_4_ = auVar23._28_4_;
    auVar127 = vsubps_avx(auVar41,auVar42);
    local_240 = auVar253._0_4_ + local_240;
    fStack_23c = auVar253._4_4_ + fStack_23c;
    fStack_238 = auVar253._8_4_ + fStack_238;
    fStack_234 = auVar253._12_4_ + fStack_234;
    fStack_230 = auVar253._16_4_ + fStack_230;
    fStack_22c = auVar253._20_4_ + fStack_22c;
    fStack_228 = auVar253._24_4_ + fStack_228;
    fStack_224 = auVar253._28_4_ + auVar239._28_4_;
    local_260 = auVar269._0_4_ + local_260;
    fStack_25c = auVar269._4_4_ + fStack_25c;
    fStack_258 = auVar269._8_4_ + fStack_258;
    fStack_254 = auVar269._12_4_ + fStack_254;
    fStack_250 = auVar269._16_4_ + local_640;
    fStack_24c = auVar269._20_4_ + fStack_63c;
    fStack_248 = auVar269._24_4_ + fStack_638;
    fStack_244 = auVar269._28_4_ + fStack_634;
    auVar43._4_4_ = fStack_25c * fVar221;
    auVar43._0_4_ = local_260 * fVar220;
    auVar43._8_4_ = fStack_258 * fVar222;
    auVar43._12_4_ = fStack_254 * fVar223;
    auVar43._16_4_ = fStack_250 * fVar224;
    auVar43._20_4_ = fStack_24c * fVar150;
    auVar43._24_4_ = fStack_248 * fVar174;
    auVar43._28_4_ = auVar269._28_4_ + fStack_634;
    auVar44._4_4_ = fStack_23c * fVar176;
    auVar44._0_4_ = local_240 * fVar175;
    auVar44._8_4_ = fStack_238 * fVar177;
    auVar44._12_4_ = fStack_234 * fVar180;
    auVar44._16_4_ = fStack_230 * fVar196;
    auVar44._20_4_ = fStack_22c * fVar198;
    auVar44._24_4_ = fStack_228 * fVar200;
    auVar44._28_4_ = fStack_224;
    auVar128 = vsubps_avx(auVar43,auVar44);
    auVar45._4_4_ = auVar27._4_4_ * fVar221;
    auVar45._0_4_ = auVar27._0_4_ * fVar220;
    auVar45._8_4_ = auVar27._8_4_ * fVar222;
    auVar45._12_4_ = auVar27._12_4_ * fVar223;
    auVar45._16_4_ = auVar27._16_4_ * fVar224;
    auVar45._20_4_ = auVar27._20_4_ * fVar150;
    auVar45._24_4_ = auVar27._24_4_ * fVar174;
    auVar45._28_4_ = fStack_224;
    auVar46._4_4_ = fVar176 * auVar26._4_4_;
    auVar46._0_4_ = fVar175 * auVar26._0_4_;
    auVar46._8_4_ = fVar177 * auVar26._8_4_;
    auVar46._12_4_ = fVar180 * auVar26._12_4_;
    auVar46._16_4_ = fVar196 * auVar26._16_4_;
    auVar46._20_4_ = fVar198 * auVar26._20_4_;
    auVar46._24_4_ = fVar200 * auVar26._24_4_;
    auVar46._28_4_ = auVar26._28_4_;
    auVar143 = vsubps_avx(auVar45,auVar46);
    auVar47._4_4_ = auVar28._4_4_ * fVar221;
    auVar47._0_4_ = auVar28._0_4_ * fVar220;
    auVar47._8_4_ = auVar28._8_4_ * fVar222;
    auVar47._12_4_ = auVar28._12_4_ * fVar223;
    auVar47._16_4_ = auVar28._16_4_ * fVar224;
    auVar47._20_4_ = auVar28._20_4_ * fVar150;
    auVar47._24_4_ = auVar28._24_4_ * fVar174;
    auVar47._28_4_ = auVar98._28_4_ + auVar22._28_4_;
    auVar48._4_4_ = auVar25._4_4_ * fVar176;
    auVar48._0_4_ = auVar25._0_4_ * fVar175;
    auVar48._8_4_ = auVar25._8_4_ * fVar177;
    auVar48._12_4_ = auVar25._12_4_ * fVar180;
    auVar48._16_4_ = auVar25._16_4_ * fVar196;
    auVar48._20_4_ = auVar25._20_4_ * fVar198;
    auVar48._24_4_ = auVar25._24_4_ * fVar200;
    auVar48._28_4_ = fVar295 + auVar99._28_4_;
    auVar98 = vsubps_avx(auVar47,auVar48);
    auVar19 = vminps_avx(auVar20,auVar21);
    auVar97 = vmaxps_avx(auVar20,auVar21);
    auVar20 = vminps_avx(auVar100,auVar126);
    auVar20 = vminps_avx(auVar19,auVar20);
    auVar19 = vmaxps_avx(auVar100,auVar126);
    auVar97 = vmaxps_avx(auVar97,auVar19);
    auVar21 = vminps_avx(auVar127,auVar128);
    auVar19 = vmaxps_avx(auVar127,auVar128);
    auVar22 = vminps_avx(auVar143,auVar98);
    auVar21 = vminps_avx(auVar21,auVar22);
    auVar21 = vminps_avx(auVar20,auVar21);
    auVar20 = vmaxps_avx(auVar143,auVar98);
    auVar19 = vmaxps_avx(auVar19,auVar20);
    auVar19 = vmaxps_avx(auVar97,auVar19);
    auVar97 = vcmpps_avx(auVar21,local_280,2);
    auVar19 = vcmpps_avx(auVar19,local_2a0,5);
    auVar97 = vandps_avx(auVar19,auVar97);
    auVar19 = local_340 & auVar97;
    uVar87 = 0;
    if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar19 >> 0x7f,0) != '\0') ||
          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar19 >> 0xbf,0) != '\0') ||
        (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar19[0x1f] < '\0')
    {
      auVar19 = vsubps_avx(auVar24,local_1c0);
      auVar20 = vsubps_avx(auVar25,auVar253);
      fVar221 = auVar19._0_4_ + auVar20._0_4_;
      fVar222 = auVar19._4_4_ + auVar20._4_4_;
      fVar223 = auVar19._8_4_ + auVar20._8_4_;
      fVar224 = auVar19._12_4_ + auVar20._12_4_;
      fVar150 = auVar19._16_4_ + auVar20._16_4_;
      fVar174 = auVar19._20_4_ + auVar20._20_4_;
      fVar175 = auVar19._24_4_ + auVar20._24_4_;
      auVar21 = vsubps_avx(local_200,local_1e0);
      auVar22 = vsubps_avx(auVar28,auVar269);
      fVar176 = auVar21._0_4_ + auVar22._0_4_;
      fVar177 = auVar21._4_4_ + auVar22._4_4_;
      fVar180 = auVar21._8_4_ + auVar22._8_4_;
      fVar196 = auVar21._12_4_ + auVar22._12_4_;
      fVar198 = auVar21._16_4_ + auVar22._16_4_;
      fVar200 = auVar21._20_4_ + auVar22._20_4_;
      fVar295 = auVar21._24_4_ + auVar22._24_4_;
      fVar220 = auVar22._28_4_;
      auVar49._4_4_ = local_1e0._4_4_ * fVar222;
      auVar49._0_4_ = local_1e0._0_4_ * fVar221;
      auVar49._8_4_ = local_1e0._8_4_ * fVar223;
      auVar49._12_4_ = local_1e0._12_4_ * fVar224;
      auVar49._16_4_ = local_1e0._16_4_ * fVar150;
      auVar49._20_4_ = local_1e0._20_4_ * fVar174;
      auVar49._24_4_ = local_1e0._24_4_ * fVar175;
      auVar49._28_4_ = local_1e0._28_4_;
      auVar50._4_4_ = local_1c0._4_4_ * fVar177;
      auVar50._0_4_ = local_1c0._0_4_ * fVar176;
      auVar50._8_4_ = local_1c0._8_4_ * fVar180;
      auVar50._12_4_ = local_1c0._12_4_ * fVar196;
      auVar50._16_4_ = local_1c0._16_4_ * fVar198;
      auVar50._20_4_ = local_1c0._20_4_ * fVar200;
      auVar50._24_4_ = local_1c0._24_4_ * fVar295;
      auVar50._28_4_ = local_1c0._28_4_;
      auVar22 = vsubps_avx(auVar49,auVar50);
      auVar51._4_4_ = fVar316 * fVar222;
      auVar51._0_4_ = fVar314 * fVar221;
      auVar51._8_4_ = fVar318 * fVar223;
      auVar51._12_4_ = fVar333 * fVar224;
      auVar51._16_4_ = fVar334 * fVar150;
      auVar51._20_4_ = fVar337 * fVar174;
      auVar51._24_4_ = fVar343 * fVar175;
      auVar51._28_4_ = local_1e0._28_4_;
      auVar52._4_4_ = fVar177 * fStack_21c;
      auVar52._0_4_ = fVar176 * local_220;
      auVar52._8_4_ = fVar180 * fStack_218;
      auVar52._12_4_ = fVar196 * fStack_214;
      auVar52._16_4_ = fVar198 * fStack_210;
      auVar52._20_4_ = fVar200 * fStack_20c;
      auVar52._24_4_ = fVar295 * fStack_208;
      auVar52._28_4_ = fVar220;
      auVar98 = vsubps_avx(auVar51,auVar52);
      auVar53._4_4_ = fVar222 * auVar23._4_4_;
      auVar53._0_4_ = fVar221 * auVar23._0_4_;
      auVar53._8_4_ = fVar223 * auVar23._8_4_;
      auVar53._12_4_ = fVar224 * auVar23._12_4_;
      auVar53._16_4_ = fVar150 * auVar23._16_4_;
      auVar53._20_4_ = fVar174 * auVar23._20_4_;
      auVar53._24_4_ = fVar175 * auVar23._24_4_;
      auVar53._28_4_ = fVar220;
      auVar54._4_4_ = fVar177 * fStack_5dc;
      auVar54._0_4_ = fVar176 * local_5e0;
      auVar54._8_4_ = fVar180 * fStack_5d8;
      auVar54._12_4_ = fVar196 * fStack_5d4;
      auVar54._16_4_ = fVar198 * fStack_5d0;
      auVar54._20_4_ = fVar200 * fStack_5cc;
      auVar54._24_4_ = fVar295 * fStack_5c8;
      auVar54._28_4_ = local_1e0._28_4_ + auVar192._28_4_;
      auVar23 = vsubps_avx(auVar53,auVar54);
      auVar55._4_4_ = local_200._4_4_ * fVar222;
      auVar55._0_4_ = local_200._0_4_ * fVar221;
      auVar55._8_4_ = local_200._8_4_ * fVar223;
      auVar55._12_4_ = local_200._12_4_ * fVar224;
      auVar55._16_4_ = local_200._16_4_ * fVar150;
      auVar55._20_4_ = local_200._20_4_ * fVar174;
      auVar55._24_4_ = local_200._24_4_ * fVar175;
      auVar55._28_4_ = local_1e0._28_4_ + auVar192._28_4_;
      auVar56._4_4_ = auVar24._4_4_ * fVar177;
      auVar56._0_4_ = auVar24._0_4_ * fVar176;
      auVar56._8_4_ = auVar24._8_4_ * fVar180;
      auVar56._12_4_ = auVar24._12_4_ * fVar196;
      auVar56._16_4_ = auVar24._16_4_ * fVar198;
      auVar56._20_4_ = auVar24._20_4_ * fVar200;
      uVar6 = auVar24._28_4_;
      auVar56._24_4_ = auVar24._24_4_ * fVar295;
      auVar56._28_4_ = uVar6;
      auVar24 = vsubps_avx(auVar55,auVar56);
      auVar57._4_4_ = auVar269._4_4_ * fVar222;
      auVar57._0_4_ = auVar269._0_4_ * fVar221;
      auVar57._8_4_ = auVar269._8_4_ * fVar223;
      auVar57._12_4_ = auVar269._12_4_ * fVar224;
      auVar57._16_4_ = auVar269._16_4_ * fVar150;
      auVar57._20_4_ = auVar269._20_4_ * fVar174;
      auVar57._24_4_ = auVar269._24_4_ * fVar175;
      auVar57._28_4_ = auVar269._28_4_;
      auVar58._4_4_ = auVar253._4_4_ * fVar177;
      auVar58._0_4_ = auVar253._0_4_ * fVar176;
      auVar58._8_4_ = auVar253._8_4_ * fVar180;
      auVar58._12_4_ = auVar253._12_4_ * fVar196;
      auVar58._16_4_ = auVar253._16_4_ * fVar198;
      auVar58._20_4_ = auVar253._20_4_ * fVar200;
      auVar58._24_4_ = auVar253._24_4_ * fVar295;
      auVar58._28_4_ = auVar253._28_4_;
      auVar99 = vsubps_avx(auVar57,auVar58);
      auVar59._4_4_ = fVar222 * fStack_25c;
      auVar59._0_4_ = fVar221 * local_260;
      auVar59._8_4_ = fVar223 * fStack_258;
      auVar59._12_4_ = fVar224 * fStack_254;
      auVar59._16_4_ = fVar150 * fStack_250;
      auVar59._20_4_ = fVar174 * fStack_24c;
      auVar59._24_4_ = fVar175 * fStack_248;
      auVar59._28_4_ = auVar269._28_4_;
      auVar60._4_4_ = fVar177 * fStack_23c;
      auVar60._0_4_ = fVar176 * local_240;
      auVar60._8_4_ = fVar180 * fStack_238;
      auVar60._12_4_ = fVar196 * fStack_234;
      auVar60._16_4_ = fVar198 * fStack_230;
      auVar60._20_4_ = fVar200 * fStack_22c;
      auVar60._24_4_ = fVar295 * fStack_228;
      auVar60._28_4_ = uVar6;
      auVar100 = vsubps_avx(auVar59,auVar60);
      auVar61._4_4_ = fVar222 * auVar27._4_4_;
      auVar61._0_4_ = fVar221 * auVar27._0_4_;
      auVar61._8_4_ = fVar223 * auVar27._8_4_;
      auVar61._12_4_ = fVar224 * auVar27._12_4_;
      auVar61._16_4_ = fVar150 * auVar27._16_4_;
      auVar61._20_4_ = fVar174 * auVar27._20_4_;
      auVar61._24_4_ = fVar175 * auVar27._24_4_;
      auVar61._28_4_ = uVar6;
      auVar62._4_4_ = fVar177 * auVar26._4_4_;
      auVar62._0_4_ = fVar176 * auVar26._0_4_;
      auVar62._8_4_ = fVar180 * auVar26._8_4_;
      auVar62._12_4_ = fVar196 * auVar26._12_4_;
      auVar62._16_4_ = fVar198 * auVar26._16_4_;
      auVar62._20_4_ = fVar200 * auVar26._20_4_;
      auVar62._24_4_ = fVar295 * auVar26._24_4_;
      auVar62._28_4_ = local_200._28_4_;
      auVar26 = vsubps_avx(auVar61,auVar62);
      auVar63._4_4_ = auVar28._4_4_ * fVar222;
      auVar63._0_4_ = auVar28._0_4_ * fVar221;
      auVar63._8_4_ = auVar28._8_4_ * fVar223;
      auVar63._12_4_ = auVar28._12_4_ * fVar224;
      auVar63._16_4_ = auVar28._16_4_ * fVar150;
      auVar63._20_4_ = auVar28._20_4_ * fVar174;
      auVar63._24_4_ = auVar28._24_4_ * fVar175;
      auVar63._28_4_ = auVar19._28_4_ + auVar20._28_4_;
      auVar64._4_4_ = auVar25._4_4_ * fVar177;
      auVar64._0_4_ = auVar25._0_4_ * fVar176;
      auVar64._8_4_ = auVar25._8_4_ * fVar180;
      auVar64._12_4_ = auVar25._12_4_ * fVar196;
      auVar64._16_4_ = auVar25._16_4_ * fVar198;
      auVar64._20_4_ = auVar25._20_4_ * fVar200;
      auVar64._24_4_ = auVar25._24_4_ * fVar295;
      auVar64._28_4_ = auVar21._28_4_ + fVar220;
      auVar25 = vsubps_avx(auVar63,auVar64);
      auVar20 = vminps_avx(auVar22,auVar98);
      auVar19 = vmaxps_avx(auVar22,auVar98);
      auVar21 = vminps_avx(auVar23,auVar24);
      auVar21 = vminps_avx(auVar20,auVar21);
      auVar20 = vmaxps_avx(auVar23,auVar24);
      auVar19 = vmaxps_avx(auVar19,auVar20);
      auVar22 = vminps_avx(auVar99,auVar100);
      auVar20 = vmaxps_avx(auVar99,auVar100);
      auVar23 = vminps_avx(auVar26,auVar25);
      auVar22 = vminps_avx(auVar22,auVar23);
      auVar22 = vminps_avx(auVar21,auVar22);
      auVar21 = vmaxps_avx(auVar26,auVar25);
      auVar20 = vmaxps_avx(auVar20,auVar21);
      auVar20 = vmaxps_avx(auVar19,auVar20);
      auVar19 = vcmpps_avx(auVar22,local_280,2);
      auVar20 = vcmpps_avx(auVar20,local_2a0,5);
      auVar19 = vandps_avx(auVar20,auVar19);
      auVar97 = vandps_avx(auVar97,local_340);
      auVar20 = auVar97 & auVar19;
      if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar20 >> 0x7f,0) != '\0') ||
            (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar20 >> 0xbf,0) != '\0') ||
          (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar20[0x1f] < '\0') {
        auVar97 = vandps_avx(auVar19,auVar97);
        uVar87 = vmovmskps_avx(auVar97);
      }
    }
    if (uVar87 != 0) {
      auStack_490[uVar89] = uVar87;
      uVar7 = vmovlps_avx(local_400);
      *(undefined8 *)(afStack_320 + uVar89 * 2) = uVar7;
      uVar8 = vmovlps_avx(_local_6b0);
      auStack_1a0[uVar89] = uVar8;
      uVar89 = (ulong)((int)uVar89 + 1);
    }
    auVar342 = ZEXT864(0) << 0x20;
    auVar355 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,&DAT_3f8000003f800000)));
    do {
      if ((int)uVar89 == 0) {
        if (bVar81) {
          return local_6f1;
        }
        uVar6 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar107._4_4_ = uVar6;
        auVar107._0_4_ = uVar6;
        auVar107._8_4_ = uVar6;
        auVar107._12_4_ = uVar6;
        auVar107._16_4_ = uVar6;
        auVar107._20_4_ = uVar6;
        auVar107._24_4_ = uVar6;
        auVar107._28_4_ = uVar6;
        auVar97 = vcmpps_avx(local_2c0,auVar107,2);
        uVar82 = vmovmskps_avx(auVar97);
        uVar82 = (uint)uVar90 & uVar82;
        local_6f1 = uVar82 != 0;
        if (!local_6f1) {
          return local_6f1;
        }
        goto LAB_010e4d0d;
      }
      uVar85 = (int)uVar89 - 1;
      uVar86 = (ulong)uVar85;
      uVar87 = auStack_490[uVar86];
      fVar220 = afStack_320[uVar86 * 2];
      fVar221 = afStack_320[uVar86 * 2 + 1];
      register0x00001508 = 0;
      local_6b0 = (undefined1  [8])auStack_1a0[uVar86];
      uVar8 = 0;
      if (uVar87 != 0) {
        for (; (uVar87 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
        }
      }
      uVar87 = uVar87 - 1 & uVar87;
      auStack_490[uVar86] = uVar87;
      if (uVar87 == 0) {
        uVar89 = (ulong)uVar85;
      }
      fVar223 = (float)(uVar8 + 1) * 0.14285715;
      fVar222 = (1.0 - (float)uVar8 * 0.14285715) * fVar220 + fVar221 * (float)uVar8 * 0.14285715;
      fVar220 = (1.0 - fVar223) * fVar220 + fVar221 * fVar223;
      fVar221 = fVar220 - fVar222;
      if (0.16666667 <= fVar221) break;
      auVar117 = vshufps_avx(_local_6b0,_local_6b0,0x50);
      auVar229 = vsubps_avx(auVar355._0_16_,auVar117);
      fVar223 = auVar117._0_4_;
      fVar150 = auVar117._4_4_;
      fVar175 = auVar117._8_4_;
      fVar177 = auVar117._12_4_;
      fVar224 = auVar229._0_4_;
      fVar174 = auVar229._4_4_;
      fVar176 = auVar229._8_4_;
      fVar180 = auVar229._12_4_;
      auVar155._0_4_ = auVar286._0_4_ * fVar223 + auVar311._0_4_ * fVar224;
      auVar155._4_4_ = auVar286._4_4_ * fVar150 + auVar311._4_4_ * fVar174;
      auVar155._8_4_ = auVar286._0_4_ * fVar175 + auVar311._0_4_ * fVar176;
      auVar155._12_4_ = auVar286._4_4_ * fVar177 + auVar311._4_4_ * fVar180;
      auVar184._0_4_ = auVar257._0_4_ * fVar223 + fVar178 * fVar224;
      auVar184._4_4_ = auVar257._4_4_ * fVar150 + fVar179 * fVar174;
      auVar184._8_4_ = auVar257._0_4_ * fVar175 + fVar178 * fVar176;
      auVar184._12_4_ = auVar257._4_4_ * fVar177 + fVar179 * fVar180;
      auVar209._0_4_ = auVar111._0_4_ * fVar223 + fVar224 * auVar339._0_4_;
      auVar209._4_4_ = auVar111._4_4_ * fVar150 + fVar174 * auVar339._4_4_;
      auVar209._8_4_ = auVar111._0_4_ * fVar175 + fVar176 * auVar339._0_4_;
      auVar209._12_4_ = auVar111._4_4_ * fVar177 + fVar180 * auVar339._4_4_;
      auVar113._0_4_ = auVar93._0_4_ * fVar223 + fVar224 * (float)local_4a0._0_4_;
      auVar113._4_4_ = auVar93._4_4_ * fVar150 + fVar174 * (float)local_4a0._4_4_;
      auVar113._8_4_ = auVar93._0_4_ * fVar175 + fVar176 * fStack_498;
      auVar113._12_4_ = auVar93._4_4_ * fVar177 + fVar180 * fStack_494;
      auVar146._16_16_ = auVar155;
      auVar146._0_16_ = auVar155;
      auVar171._16_16_ = auVar184;
      auVar171._0_16_ = auVar184;
      auVar194._16_16_ = auVar209;
      auVar194._0_16_ = auVar209;
      auVar97 = vshufps_avx(ZEXT2032(CONCAT416(fVar220,ZEXT416((uint)fVar222))),
                            ZEXT2032(CONCAT416(fVar220,ZEXT416((uint)fVar222))),0);
      auVar19 = vsubps_avx(auVar171,auVar146);
      fVar223 = auVar97._0_4_;
      fVar224 = auVar97._4_4_;
      fVar150 = auVar97._8_4_;
      fVar174 = auVar97._12_4_;
      fVar175 = auVar97._16_4_;
      fVar176 = auVar97._20_4_;
      fVar177 = auVar97._24_4_;
      auVar147._0_4_ = auVar155._0_4_ + auVar19._0_4_ * fVar223;
      auVar147._4_4_ = auVar155._4_4_ + auVar19._4_4_ * fVar224;
      auVar147._8_4_ = auVar155._8_4_ + auVar19._8_4_ * fVar150;
      auVar147._12_4_ = auVar155._12_4_ + auVar19._12_4_ * fVar174;
      auVar147._16_4_ = auVar155._0_4_ + auVar19._16_4_ * fVar175;
      auVar147._20_4_ = auVar155._4_4_ + auVar19._20_4_ * fVar176;
      auVar147._24_4_ = auVar155._8_4_ + auVar19._24_4_ * fVar177;
      auVar147._28_4_ = auVar155._12_4_ + auVar19._28_4_;
      auVar19 = vsubps_avx(auVar194,auVar171);
      auVar172._0_4_ = auVar184._0_4_ + auVar19._0_4_ * fVar223;
      auVar172._4_4_ = auVar184._4_4_ + auVar19._4_4_ * fVar224;
      auVar172._8_4_ = auVar184._8_4_ + auVar19._8_4_ * fVar150;
      auVar172._12_4_ = auVar184._12_4_ + auVar19._12_4_ * fVar174;
      auVar172._16_4_ = auVar184._0_4_ + auVar19._16_4_ * fVar175;
      auVar172._20_4_ = auVar184._4_4_ + auVar19._20_4_ * fVar176;
      auVar172._24_4_ = auVar184._8_4_ + auVar19._24_4_ * fVar177;
      auVar172._28_4_ = auVar184._12_4_ + auVar19._28_4_;
      auVar117 = vsubps_avx(auVar113,auVar209);
      auVar129._0_4_ = auVar209._0_4_ + auVar117._0_4_ * fVar223;
      auVar129._4_4_ = auVar209._4_4_ + auVar117._4_4_ * fVar224;
      auVar129._8_4_ = auVar209._8_4_ + auVar117._8_4_ * fVar150;
      auVar129._12_4_ = auVar209._12_4_ + auVar117._12_4_ * fVar174;
      auVar129._16_4_ = auVar209._0_4_ + auVar117._0_4_ * fVar175;
      auVar129._20_4_ = auVar209._4_4_ + auVar117._4_4_ * fVar176;
      auVar129._24_4_ = auVar209._8_4_ + auVar117._8_4_ * fVar177;
      auVar129._28_4_ = auVar209._12_4_ + auVar117._12_4_;
      auVar19 = vsubps_avx(auVar172,auVar147);
      auVar148._0_4_ = auVar147._0_4_ + fVar223 * auVar19._0_4_;
      auVar148._4_4_ = auVar147._4_4_ + fVar224 * auVar19._4_4_;
      auVar148._8_4_ = auVar147._8_4_ + fVar150 * auVar19._8_4_;
      auVar148._12_4_ = auVar147._12_4_ + fVar174 * auVar19._12_4_;
      auVar148._16_4_ = auVar147._16_4_ + fVar175 * auVar19._16_4_;
      auVar148._20_4_ = auVar147._20_4_ + fVar176 * auVar19._20_4_;
      auVar148._24_4_ = auVar147._24_4_ + fVar177 * auVar19._24_4_;
      auVar148._28_4_ = auVar147._28_4_ + auVar19._28_4_;
      auVar19 = vsubps_avx(auVar129,auVar172);
      auVar130._0_4_ = auVar172._0_4_ + fVar223 * auVar19._0_4_;
      auVar130._4_4_ = auVar172._4_4_ + fVar224 * auVar19._4_4_;
      auVar130._8_4_ = auVar172._8_4_ + fVar150 * auVar19._8_4_;
      auVar130._12_4_ = auVar172._12_4_ + fVar174 * auVar19._12_4_;
      auVar130._16_4_ = auVar172._16_4_ + fVar175 * auVar19._16_4_;
      auVar130._20_4_ = auVar172._20_4_ + fVar176 * auVar19._20_4_;
      auVar130._24_4_ = auVar172._24_4_ + fVar177 * auVar19._24_4_;
      auVar130._28_4_ = auVar172._28_4_ + auVar19._28_4_;
      auVar19 = vsubps_avx(auVar130,auVar148);
      auVar156._0_4_ = auVar148._0_4_ + fVar223 * auVar19._0_4_;
      auVar156._4_4_ = auVar148._4_4_ + fVar224 * auVar19._4_4_;
      auVar156._8_4_ = auVar148._8_4_ + fVar150 * auVar19._8_4_;
      auVar156._12_4_ = auVar148._12_4_ + fVar174 * auVar19._12_4_;
      auVar173._16_4_ = auVar148._16_4_ + fVar175 * auVar19._16_4_;
      auVar173._0_16_ = auVar156;
      auVar173._20_4_ = auVar148._20_4_ + fVar176 * auVar19._20_4_;
      auVar173._24_4_ = auVar148._24_4_ + fVar177 * auVar19._24_4_;
      auVar173._28_4_ = auVar148._28_4_ + auVar172._28_4_;
      fVar223 = auVar19._4_4_ * 3.0;
      auVar136 = auVar173._16_16_;
      auVar116 = vshufps_avx(ZEXT416((uint)(fVar221 * 0.33333334)),
                             ZEXT416((uint)(fVar221 * 0.33333334)),0);
      auVar275._0_4_ = auVar156._0_4_ + auVar116._0_4_ * auVar19._0_4_ * 3.0;
      auVar275._4_4_ = auVar156._4_4_ + auVar116._4_4_ * fVar223;
      auVar275._8_4_ = auVar156._8_4_ + auVar116._8_4_ * auVar19._8_4_ * 3.0;
      auVar275._12_4_ = auVar156._12_4_ + auVar116._12_4_ * auVar19._12_4_ * 3.0;
      auVar216 = vshufpd_avx(auVar156,auVar156,3);
      auVar162 = vshufpd_avx(auVar136,auVar136,3);
      auVar117 = vsubps_avx(auVar216,auVar156);
      auVar229 = vsubps_avx(auVar162,auVar136);
      auVar114._0_4_ = auVar117._0_4_ + auVar229._0_4_;
      auVar114._4_4_ = auVar117._4_4_ + auVar229._4_4_;
      auVar114._8_4_ = auVar117._8_4_ + auVar229._8_4_;
      auVar114._12_4_ = auVar117._12_4_ + auVar229._12_4_;
      auVar117 = vmovshdup_avx(auVar156);
      auVar229 = vmovshdup_avx(auVar275);
      auVar161 = vshufps_avx(auVar114,auVar114,0);
      auVar95 = vshufps_avx(auVar114,auVar114,0x55);
      fVar176 = auVar95._0_4_;
      fVar177 = auVar95._4_4_;
      fVar180 = auVar95._8_4_;
      fVar196 = auVar95._12_4_;
      fVar224 = auVar161._0_4_;
      fVar150 = auVar161._4_4_;
      fVar174 = auVar161._8_4_;
      fVar175 = auVar161._12_4_;
      auVar258._0_4_ = fVar224 * auVar156._0_4_ + fVar176 * auVar117._0_4_;
      auVar258._4_4_ = fVar150 * auVar156._4_4_ + fVar177 * auVar117._4_4_;
      auVar258._8_4_ = fVar174 * auVar156._8_4_ + fVar180 * auVar117._8_4_;
      auVar258._12_4_ = fVar175 * auVar156._12_4_ + fVar196 * auVar117._12_4_;
      auVar276._0_4_ = auVar275._0_4_ * fVar224 + fVar176 * auVar229._0_4_;
      auVar276._4_4_ = auVar275._4_4_ * fVar150 + fVar177 * auVar229._4_4_;
      auVar276._8_4_ = auVar275._8_4_ * fVar174 + fVar180 * auVar229._8_4_;
      auVar276._12_4_ = auVar275._12_4_ * fVar175 + fVar196 * auVar229._12_4_;
      auVar229 = vshufps_avx(auVar258,auVar258,0xe8);
      auVar161 = vshufps_avx(auVar276,auVar276,0xe8);
      auVar117 = vcmpps_avx(auVar229,auVar161,1);
      uVar87 = vextractps_avx(auVar117,0);
      auVar95 = auVar276;
      if ((uVar87 & 1) == 0) {
        auVar95 = auVar258;
      }
      auVar115._0_4_ = auVar116._0_4_ * auVar19._16_4_ * 3.0;
      auVar115._4_4_ = auVar116._4_4_ * fVar223;
      auVar115._8_4_ = auVar116._8_4_ * auVar19._24_4_ * 3.0;
      auVar115._12_4_ = auVar116._12_4_ * auVar97._28_4_;
      auVar108 = vsubps_avx(auVar136,auVar115);
      auVar116 = vmovshdup_avx(auVar108);
      auVar136 = vmovshdup_avx(auVar136);
      fVar223 = auVar108._0_4_;
      fVar198 = auVar108._4_4_;
      auVar350._0_4_ = fVar224 * fVar223 + fVar176 * auVar116._0_4_;
      auVar350._4_4_ = fVar150 * fVar198 + fVar177 * auVar116._4_4_;
      auVar350._8_4_ = fVar174 * auVar108._8_4_ + fVar180 * auVar116._8_4_;
      auVar350._12_4_ = fVar175 * auVar108._12_4_ + fVar196 * auVar116._12_4_;
      auVar328._0_4_ = fVar224 * auVar173._16_4_ + fVar176 * auVar136._0_4_;
      auVar328._4_4_ = fVar150 * auVar173._20_4_ + fVar177 * auVar136._4_4_;
      auVar328._8_4_ = fVar174 * auVar173._24_4_ + fVar180 * auVar136._8_4_;
      auVar328._12_4_ = fVar175 * auVar173._28_4_ + fVar196 * auVar136._12_4_;
      auVar136 = vshufps_avx(auVar350,auVar350,0xe8);
      auVar92 = vshufps_avx(auVar328,auVar328,0xe8);
      auVar116 = vcmpps_avx(auVar136,auVar92,1);
      uVar87 = vextractps_avx(auVar116,0);
      auVar109 = auVar328;
      if ((uVar87 & 1) == 0) {
        auVar109 = auVar350;
      }
      auVar95 = vmaxss_avx(auVar109,auVar95);
      auVar229 = vminps_avx(auVar229,auVar161);
      auVar161 = vminps_avx(auVar136,auVar92);
      auVar161 = vminps_avx(auVar229,auVar161);
      auVar117 = vshufps_avx(auVar117,auVar117,0x55);
      auVar117 = vblendps_avx(auVar117,auVar116,2);
      auVar116 = vpslld_avx(auVar117,0x1f);
      auVar117 = vshufpd_avx(auVar276,auVar276,1);
      auVar117 = vinsertps_avx(auVar117,auVar328,0x9c);
      auVar229 = vshufpd_avx(auVar258,auVar258,1);
      auVar229 = vinsertps_avx(auVar229,auVar350,0x9c);
      auVar117 = vblendvps_avx(auVar229,auVar117,auVar116);
      auVar229 = vmovshdup_avx(auVar117);
      auVar117 = vmaxss_avx(auVar229,auVar117);
      fVar174 = auVar161._0_4_;
      auVar229 = vmovshdup_avx(auVar161);
      fVar150 = auVar117._0_4_;
      fVar175 = auVar229._0_4_;
      fVar224 = auVar95._0_4_;
      if ((0.0001 <= fVar174) || (fVar150 <= -0.0001)) {
        if ((-0.0001 < fVar224 && fVar175 < 0.0001) ||
           ((fVar174 < 0.0001 && -0.0001 < fVar224 || (fVar175 < 0.0001 && -0.0001 < fVar150))))
        goto LAB_010e5f66;
LAB_010e6b7e:
        bVar65 = true;
        auVar342 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar355 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,&DAT_3f8000003f800000)));
      }
      else {
LAB_010e5f66:
        auVar342 = ZEXT864(0) << 0x20;
        auVar116 = vcmpps_avx(auVar161,ZEXT816(0) << 0x20,1);
        auVar229 = vcmpss_avx(auVar95,ZEXT416(0),1);
        auVar351._8_4_ = 0x3f800000;
        auVar351._0_8_ = &DAT_3f8000003f800000;
        auVar351._12_4_ = 0x3f800000;
        auVar355 = ZEXT1664(auVar351);
        auVar210._8_4_ = 0xbf800000;
        auVar210._0_8_ = 0xbf800000bf800000;
        auVar210._12_4_ = 0xbf800000;
        auVar229 = vblendvps_avx(auVar351,auVar210,auVar229);
        auVar116 = vblendvps_avx(auVar351,auVar210,auVar116);
        auVar136 = vcmpss_avx(auVar229,auVar116,4);
        auVar136 = vpshufd_avx(ZEXT416(auVar136._0_4_ & 1),0x50);
        auVar136 = vpslld_avx(auVar136,0x1f);
        auVar136 = vpsrad_avx(auVar136,0x1f);
        auVar136 = vpandn_avx(auVar136,_DAT_02020eb0);
        auVar92 = vmovshdup_avx(auVar116);
        fVar176 = auVar92._0_4_;
        if ((auVar116._0_4_ != fVar176) || (NAN(auVar116._0_4_) || NAN(fVar176))) {
          if ((fVar175 != fVar174) || (NAN(fVar175) || NAN(fVar174))) {
            fVar174 = -fVar174 / (fVar175 - fVar174);
            auVar116 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar174) * 0.0 + fVar174)));
          }
          else {
            auVar116 = vcmpss_avx(auVar161,ZEXT416(0),0);
            auVar116 = vpshufd_avx(ZEXT416(auVar116._0_4_ & 1),0x50);
            auVar116 = vpslld_avx(auVar116,0x1f);
            auVar116 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar116);
          }
          auVar92 = vcmpps_avx(auVar136,auVar116,1);
          auVar161 = vblendps_avx(auVar136,auVar116,2);
          auVar116 = vblendps_avx(auVar116,auVar136,2);
          auVar136 = vblendvps_avx(auVar116,auVar161,auVar92);
        }
        auVar117 = vcmpss_avx(auVar117,ZEXT416(0),1);
        auVar137._8_4_ = 0xbf800000;
        auVar137._0_8_ = 0xbf800000bf800000;
        auVar137._12_4_ = 0xbf800000;
        auVar117 = vblendvps_avx(auVar351,auVar137,auVar117);
        fVar174 = auVar117._0_4_;
        if ((auVar229._0_4_ != fVar174) || (NAN(auVar229._0_4_) || NAN(fVar174))) {
          if ((fVar150 != fVar224) || (NAN(fVar150) || NAN(fVar224))) {
            fVar224 = -fVar224 / (fVar150 - fVar224);
            auVar117 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar224) * 0.0 + fVar224)));
          }
          else {
            auVar117 = vcmpss_avx(auVar95,ZEXT416(0),0);
            auVar117 = vpshufd_avx(ZEXT416(auVar117._0_4_ & 1),0x50);
            auVar117 = vpslld_avx(auVar117,0x1f);
            auVar117 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar117);
          }
          auVar116 = vcmpps_avx(auVar136,auVar117,1);
          auVar229 = vblendps_avx(auVar136,auVar117,2);
          auVar117 = vblendps_avx(auVar117,auVar136,2);
          auVar136 = vblendvps_avx(auVar117,auVar229,auVar116);
        }
        if ((fVar176 != fVar174) || (NAN(fVar176) || NAN(fVar174))) {
          auVar117 = vcmpps_avx(auVar136,auVar351,1);
          auVar229 = vinsertps_avx(auVar136,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar211._4_12_ = auVar136._4_12_;
          auVar211._0_4_ = 0x3f800000;
          auVar136 = vblendvps_avx(auVar211,auVar229,auVar117);
        }
        auVar117 = vcmpps_avx(auVar136,_DAT_01fec6f0,1);
        auVar67._12_4_ = 0;
        auVar67._0_12_ = auVar136._4_12_;
        auVar229 = vinsertps_avx(auVar136,ZEXT416(0x3f800000),0x10);
        auVar117 = vblendvps_avx(auVar229,auVar67 << 0x20,auVar117);
        auVar229 = vmovshdup_avx(auVar117);
        bVar65 = true;
        if (auVar117._0_4_ <= auVar229._0_4_) {
          auVar118._0_4_ = auVar117._0_4_ + -0.1;
          auVar118._4_4_ = auVar117._4_4_ + 0.1;
          auVar118._8_4_ = auVar117._8_4_ + 0.0;
          auVar118._12_4_ = auVar117._12_4_ + 0.0;
          auVar116 = vshufpd_avx(auVar275,auVar275,3);
          auVar157._8_8_ = 0x3f80000000000000;
          auVar157._0_8_ = 0x3f80000000000000;
          auVar117 = vcmpps_avx(auVar118,auVar157,1);
          auVar68._12_4_ = 0;
          auVar68._0_12_ = auVar118._4_12_;
          auVar229 = vinsertps_avx(auVar118,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar117 = vblendvps_avx(auVar229,auVar68 << 0x20,auVar117);
          auVar229 = vshufpd_avx(auVar108,auVar108,3);
          auVar161 = vshufps_avx(auVar117,auVar117,0x50);
          auVar95 = vsubps_avx(auVar351,auVar161);
          local_620 = auVar216._0_4_;
          fStack_61c = auVar216._4_4_;
          fStack_618 = auVar216._8_4_;
          fStack_614 = auVar216._12_4_;
          fVar224 = auVar161._0_4_;
          fVar150 = auVar161._4_4_;
          fVar174 = auVar161._8_4_;
          fVar175 = auVar161._12_4_;
          local_660 = auVar162._0_4_;
          fStack_65c = auVar162._4_4_;
          fStack_658 = auVar162._8_4_;
          fStack_654 = auVar162._12_4_;
          fVar176 = auVar95._0_4_;
          fVar177 = auVar95._4_4_;
          fVar180 = auVar95._8_4_;
          fVar196 = auVar95._12_4_;
          auVar138._0_4_ = fVar224 * local_620 + fVar176 * auVar156._0_4_;
          auVar138._4_4_ = fVar150 * fStack_61c + fVar177 * auVar156._4_4_;
          auVar138._8_4_ = fVar174 * fStack_618 + fVar180 * auVar156._0_4_;
          auVar138._12_4_ = fVar175 * fStack_614 + fVar196 * auVar156._4_4_;
          auVar185._0_4_ = fVar224 * auVar116._0_4_ + fVar176 * auVar275._0_4_;
          auVar185._4_4_ = fVar150 * auVar116._4_4_ + fVar177 * auVar275._4_4_;
          auVar185._8_4_ = fVar174 * auVar116._8_4_ + fVar180 * auVar275._0_4_;
          auVar185._12_4_ = fVar175 * auVar116._12_4_ + fVar196 * auVar275._4_4_;
          auVar247._0_4_ = fVar224 * auVar229._0_4_ + fVar176 * fVar223;
          auVar247._4_4_ = fVar150 * auVar229._4_4_ + fVar177 * fVar198;
          auVar247._8_4_ = fVar174 * auVar229._8_4_ + fVar180 * fVar223;
          auVar247._12_4_ = fVar175 * auVar229._12_4_ + fVar196 * fVar198;
          auVar259._0_4_ = fVar224 * local_660 + fVar176 * auVar173._16_4_;
          auVar259._4_4_ = fVar150 * fStack_65c + fVar177 * auVar173._20_4_;
          auVar259._8_4_ = fVar174 * fStack_658 + fVar180 * auVar173._16_4_;
          auVar259._12_4_ = fVar175 * fStack_654 + fVar196 * auVar173._20_4_;
          auVar162 = vsubps_avx(auVar351,auVar117);
          auVar229 = vmovshdup_avx(_local_6b0);
          auVar216 = vmovsldup_avx(_local_6b0);
          local_6b0._0_4_ = auVar162._0_4_ * auVar216._0_4_ + auVar229._0_4_ * auVar117._0_4_;
          local_6b0._4_4_ = auVar162._4_4_ * auVar216._4_4_ + auVar229._4_4_ * auVar117._4_4_;
          fStack_6a8 = auVar162._8_4_ * auVar216._8_4_ + auVar229._8_4_ * auVar117._8_4_;
          fStack_6a4 = auVar162._12_4_ * auVar216._12_4_ + auVar229._12_4_ * auVar117._12_4_;
          auVar108 = vmovshdup_avx(_local_6b0);
          auVar117 = vsubps_avx(auVar185,auVar138);
          auVar212._0_4_ = auVar117._0_4_ * 3.0;
          auVar212._4_4_ = auVar117._4_4_ * 3.0;
          auVar212._8_4_ = auVar117._8_4_ * 3.0;
          auVar212._12_4_ = auVar117._12_4_ * 3.0;
          auVar117 = vsubps_avx(auVar247,auVar185);
          auVar232._0_4_ = auVar117._0_4_ * 3.0;
          auVar232._4_4_ = auVar117._4_4_ * 3.0;
          auVar232._8_4_ = auVar117._8_4_ * 3.0;
          auVar232._12_4_ = auVar117._12_4_ * 3.0;
          auVar117 = vsubps_avx(auVar259,auVar247);
          auVar277._0_4_ = auVar117._0_4_ * 3.0;
          auVar277._4_4_ = auVar117._4_4_ * 3.0;
          auVar277._8_4_ = auVar117._8_4_ * 3.0;
          auVar277._12_4_ = auVar117._12_4_ * 3.0;
          auVar229 = vminps_avx(auVar232,auVar277);
          auVar117 = vmaxps_avx(auVar232,auVar277);
          auVar229 = vminps_avx(auVar212,auVar229);
          auVar117 = vmaxps_avx(auVar212,auVar117);
          auVar216 = vshufpd_avx(auVar229,auVar229,3);
          auVar162 = vshufpd_avx(auVar117,auVar117,3);
          auVar229 = vminps_avx(auVar229,auVar216);
          auVar117 = vmaxps_avx(auVar117,auVar162);
          auVar216 = vshufps_avx(ZEXT416((uint)(1.0 / fVar221)),ZEXT416((uint)(1.0 / fVar221)),0);
          auVar213._0_4_ = auVar216._0_4_ * auVar229._0_4_;
          auVar213._4_4_ = auVar216._4_4_ * auVar229._4_4_;
          auVar213._8_4_ = auVar216._8_4_ * auVar229._8_4_;
          auVar213._12_4_ = auVar216._12_4_ * auVar229._12_4_;
          auVar233._0_4_ = auVar117._0_4_ * auVar216._0_4_;
          auVar233._4_4_ = auVar117._4_4_ * auVar216._4_4_;
          auVar233._8_4_ = auVar117._8_4_ * auVar216._8_4_;
          auVar233._12_4_ = auVar117._12_4_ * auVar216._12_4_;
          auVar95 = ZEXT416((uint)(1.0 / (auVar108._0_4_ - (float)local_6b0._0_4_)));
          auVar117 = vshufpd_avx(auVar138,auVar138,3);
          auVar229 = vshufpd_avx(auVar185,auVar185,3);
          auVar216 = vshufpd_avx(auVar247,auVar247,3);
          auVar162 = vshufpd_avx(auVar259,auVar259,3);
          auVar117 = vsubps_avx(auVar117,auVar138);
          auVar116 = vsubps_avx(auVar229,auVar185);
          auVar161 = vsubps_avx(auVar216,auVar247);
          auVar162 = vsubps_avx(auVar162,auVar259);
          auVar229 = vminps_avx(auVar117,auVar116);
          auVar117 = vmaxps_avx(auVar117,auVar116);
          auVar216 = vminps_avx(auVar161,auVar162);
          auVar216 = vminps_avx(auVar229,auVar216);
          auVar229 = vmaxps_avx(auVar161,auVar162);
          auVar117 = vmaxps_avx(auVar117,auVar229);
          auVar229 = vshufps_avx(auVar95,auVar95,0);
          auVar287._0_4_ = auVar229._0_4_ * auVar216._0_4_;
          auVar287._4_4_ = auVar229._4_4_ * auVar216._4_4_;
          auVar287._8_4_ = auVar229._8_4_ * auVar216._8_4_;
          auVar287._12_4_ = auVar229._12_4_ * auVar216._12_4_;
          auVar299._0_4_ = auVar229._0_4_ * auVar117._0_4_;
          auVar299._4_4_ = auVar229._4_4_ * auVar117._4_4_;
          auVar299._8_4_ = auVar229._8_4_ * auVar117._8_4_;
          auVar299._12_4_ = auVar229._12_4_ * auVar117._12_4_;
          auVar117 = vmovsldup_avx(_local_6b0);
          auVar248._4_12_ = auVar117._4_12_;
          auVar248._0_4_ = fVar222;
          auVar260._4_12_ = local_6b0._4_12_;
          auVar260._0_4_ = fVar220;
          auVar96._0_4_ = (fVar220 + fVar222) * 0.5;
          auVar96._4_4_ = ((float)local_6b0._4_4_ + auVar117._4_4_) * 0.5;
          auVar96._8_4_ = (fStack_6a8 + auVar117._8_4_) * 0.5;
          auVar96._12_4_ = (fStack_6a4 + auVar117._12_4_) * 0.5;
          auVar117 = vshufps_avx(auVar96,auVar96,0);
          fVar223 = auVar117._0_4_;
          fVar224 = auVar117._4_4_;
          fVar150 = auVar117._8_4_;
          fVar174 = auVar117._12_4_;
          local_550 = auVar9._0_4_;
          fStack_54c = auVar9._4_4_;
          fStack_548 = auVar9._8_4_;
          fStack_544 = auVar9._12_4_;
          auVar186._0_4_ = fVar223 * (float)local_350._0_4_ + local_550;
          auVar186._4_4_ = fVar224 * (float)local_350._4_4_ + fStack_54c;
          auVar186._8_4_ = fVar150 * fStack_348 + fStack_548;
          auVar186._12_4_ = fVar174 * fStack_344 + fStack_544;
          local_560 = auVar298._0_4_;
          fStack_55c = auVar298._4_4_;
          fStack_558 = auVar298._8_4_;
          fStack_554 = auVar298._12_4_;
          auVar278._0_4_ = fVar223 * (float)local_360._0_4_ + local_560;
          auVar278._4_4_ = fVar224 * (float)local_360._4_4_ + fStack_55c;
          auVar278._8_4_ = fVar150 * fStack_358 + fStack_558;
          auVar278._12_4_ = fVar174 * fStack_354 + fStack_554;
          local_570 = auVar10._0_4_;
          fStack_56c = auVar10._4_4_;
          fStack_568 = auVar10._8_4_;
          fStack_564 = auVar10._12_4_;
          auVar312._0_4_ = fVar223 * (float)local_370._0_4_ + local_570;
          auVar312._4_4_ = fVar224 * (float)local_370._4_4_ + fStack_56c;
          auVar312._8_4_ = fVar150 * fStack_368 + fStack_568;
          auVar312._12_4_ = fVar174 * fStack_364 + fStack_564;
          auVar117 = vsubps_avx(auVar278,auVar186);
          auVar187._0_4_ = auVar117._0_4_ * fVar223 + auVar186._0_4_;
          auVar187._4_4_ = auVar117._4_4_ * fVar224 + auVar186._4_4_;
          auVar187._8_4_ = auVar117._8_4_ * fVar150 + auVar186._8_4_;
          auVar187._12_4_ = auVar117._12_4_ * fVar174 + auVar186._12_4_;
          auVar117 = vsubps_avx(auVar312,auVar278);
          auVar279._0_4_ = auVar278._0_4_ + auVar117._0_4_ * fVar223;
          auVar279._4_4_ = auVar278._4_4_ + auVar117._4_4_ * fVar224;
          auVar279._8_4_ = auVar278._8_4_ + auVar117._8_4_ * fVar150;
          auVar279._12_4_ = auVar278._12_4_ + auVar117._12_4_ * fVar174;
          auVar117 = vsubps_avx(auVar279,auVar187);
          fVar223 = auVar187._0_4_ + auVar117._0_4_ * fVar223;
          fVar224 = auVar187._4_4_ + auVar117._4_4_ * fVar224;
          auVar139._0_8_ = CONCAT44(fVar224,fVar223);
          auVar139._8_4_ = auVar187._8_4_ + auVar117._8_4_ * fVar150;
          auVar139._12_4_ = auVar187._12_4_ + auVar117._12_4_ * fVar174;
          fVar150 = auVar117._0_4_ * 3.0;
          fVar174 = auVar117._4_4_ * 3.0;
          auVar188._0_8_ = CONCAT44(fVar174,fVar150);
          auVar188._8_4_ = auVar117._8_4_ * 3.0;
          auVar188._12_4_ = auVar117._12_4_ * 3.0;
          auVar280._8_8_ = auVar139._0_8_;
          auVar280._0_8_ = auVar139._0_8_;
          auVar117 = vshufpd_avx(auVar139,auVar139,3);
          auVar229 = vshufps_avx(auVar96,auVar96,0x55);
          auVar161 = vsubps_avx(auVar117,auVar280);
          auVar281._0_4_ = auVar229._0_4_ * auVar161._0_4_ + fVar223;
          auVar281._4_4_ = auVar229._4_4_ * auVar161._4_4_ + fVar224;
          auVar281._8_4_ = auVar229._8_4_ * auVar161._8_4_ + fVar223;
          auVar281._12_4_ = auVar229._12_4_ * auVar161._12_4_ + fVar224;
          auVar329._8_8_ = auVar188._0_8_;
          auVar329._0_8_ = auVar188._0_8_;
          auVar117 = vshufpd_avx(auVar188,auVar188,1);
          auVar117 = vsubps_avx(auVar117,auVar329);
          auVar189._0_4_ = fVar150 + auVar229._0_4_ * auVar117._0_4_;
          auVar189._4_4_ = fVar174 + auVar229._4_4_ * auVar117._4_4_;
          auVar189._8_4_ = fVar150 + auVar229._8_4_ * auVar117._8_4_;
          auVar189._12_4_ = fVar174 + auVar229._12_4_ * auVar117._12_4_;
          auVar229 = vmovshdup_avx(auVar189);
          auVar330._0_8_ = auVar229._0_8_ ^ 0x8000000080000000;
          auVar330._8_4_ = auVar229._8_4_ ^ 0x80000000;
          auVar330._12_4_ = auVar229._12_4_ ^ 0x80000000;
          auVar216 = vmovshdup_avx(auVar161);
          auVar117 = vunpcklps_avx(auVar216,auVar330);
          auVar162 = vshufps_avx(auVar117,auVar330,4);
          auVar140._0_8_ = auVar161._0_8_ ^ 0x8000000080000000;
          auVar140._8_4_ = -auVar161._8_4_;
          auVar140._12_4_ = -auVar161._12_4_;
          auVar117 = vmovlhps_avx(auVar140,auVar189);
          auVar116 = vshufps_avx(auVar117,auVar189,8);
          auVar117 = ZEXT416((uint)(auVar216._0_4_ * auVar189._0_4_ -
                                   auVar229._0_4_ * auVar161._0_4_));
          auVar229 = vshufps_avx(auVar117,auVar117,0);
          auVar117 = vdivps_avx(auVar162,auVar229);
          auVar229 = vdivps_avx(auVar116,auVar229);
          auVar116 = vinsertps_avx(auVar213,auVar287,0x1c);
          auVar161 = vinsertps_avx(auVar233,auVar299,0x1c);
          auVar95 = vinsertps_avx(auVar287,auVar213,0x4c);
          auVar136 = vinsertps_avx(auVar299,auVar233,0x4c);
          auVar216 = vmovsldup_avx(auVar117);
          auVar300._0_4_ = auVar216._0_4_ * auVar116._0_4_;
          auVar300._4_4_ = auVar216._4_4_ * auVar116._4_4_;
          auVar300._8_4_ = auVar216._8_4_ * auVar116._8_4_;
          auVar300._12_4_ = auVar216._12_4_ * auVar116._12_4_;
          auVar288._0_4_ = auVar216._0_4_ * auVar161._0_4_;
          auVar288._4_4_ = auVar216._4_4_ * auVar161._4_4_;
          auVar288._8_4_ = auVar216._8_4_ * auVar161._8_4_;
          auVar288._12_4_ = auVar216._12_4_ * auVar161._12_4_;
          auVar162 = vminps_avx(auVar300,auVar288);
          auVar216 = vmaxps_avx(auVar288,auVar300);
          auVar92 = vmovsldup_avx(auVar229);
          auVar352._0_4_ = auVar92._0_4_ * auVar95._0_4_;
          auVar352._4_4_ = auVar92._4_4_ * auVar95._4_4_;
          auVar352._8_4_ = auVar92._8_4_ * auVar95._8_4_;
          auVar352._12_4_ = auVar92._12_4_ * auVar95._12_4_;
          auVar289._0_4_ = auVar92._0_4_ * auVar136._0_4_;
          auVar289._4_4_ = auVar92._4_4_ * auVar136._4_4_;
          auVar289._8_4_ = auVar92._8_4_ * auVar136._8_4_;
          auVar289._12_4_ = auVar92._12_4_ * auVar136._12_4_;
          auVar92 = vminps_avx(auVar352,auVar289);
          auVar119._0_4_ = auVar162._0_4_ + auVar92._0_4_;
          auVar119._4_4_ = auVar162._4_4_ + auVar92._4_4_;
          auVar119._8_4_ = auVar162._8_4_ + auVar92._8_4_;
          auVar119._12_4_ = auVar162._12_4_ + auVar92._12_4_;
          auVar162 = vmaxps_avx(auVar289,auVar352);
          auVar92 = vsubps_avx(auVar248,auVar96);
          auVar109 = vsubps_avx(auVar260,auVar96);
          auVar261._0_4_ = auVar216._0_4_ + auVar162._0_4_;
          auVar261._4_4_ = auVar216._4_4_ + auVar162._4_4_;
          auVar261._8_4_ = auVar216._8_4_ + auVar162._8_4_;
          auVar261._12_4_ = auVar216._12_4_ + auVar162._12_4_;
          auVar301._8_8_ = 0x3f800000;
          auVar301._0_8_ = 0x3f800000;
          auVar216 = vsubps_avx(auVar301,auVar261);
          auVar162 = vsubps_avx(auVar301,auVar119);
          fVar177 = auVar92._0_4_;
          auVar302._0_4_ = fVar177 * auVar216._0_4_;
          fVar180 = auVar92._4_4_;
          auVar302._4_4_ = fVar180 * auVar216._4_4_;
          fVar196 = auVar92._8_4_;
          auVar302._8_4_ = fVar196 * auVar216._8_4_;
          fVar198 = auVar92._12_4_;
          auVar302._12_4_ = fVar198 * auVar216._12_4_;
          fVar150 = auVar109._0_4_;
          auVar262._0_4_ = auVar216._0_4_ * fVar150;
          fVar174 = auVar109._4_4_;
          auVar262._4_4_ = auVar216._4_4_ * fVar174;
          fVar175 = auVar109._8_4_;
          auVar262._8_4_ = auVar216._8_4_ * fVar175;
          fVar176 = auVar109._12_4_;
          auVar262._12_4_ = auVar216._12_4_ * fVar176;
          auVar340._0_4_ = fVar177 * auVar162._0_4_;
          auVar340._4_4_ = fVar180 * auVar162._4_4_;
          auVar340._8_4_ = fVar196 * auVar162._8_4_;
          auVar340._12_4_ = fVar198 * auVar162._12_4_;
          auVar120._0_4_ = fVar150 * auVar162._0_4_;
          auVar120._4_4_ = fVar174 * auVar162._4_4_;
          auVar120._8_4_ = fVar175 * auVar162._8_4_;
          auVar120._12_4_ = fVar176 * auVar162._12_4_;
          auVar216 = vminps_avx(auVar302,auVar340);
          auVar162 = vminps_avx(auVar262,auVar120);
          auVar92 = vminps_avx(auVar216,auVar162);
          auVar216 = vmaxps_avx(auVar340,auVar302);
          auVar162 = vmaxps_avx(auVar120,auVar262);
          auVar109 = vshufps_avx(auVar96,auVar96,0x54);
          auVar162 = vmaxps_avx(auVar162,auVar216);
          auVar132 = vshufps_avx(auVar281,auVar281,0);
          auVar151 = vshufps_avx(auVar281,auVar281,0x55);
          auVar216 = vhaddps_avx(auVar92,auVar92);
          auVar162 = vhaddps_avx(auVar162,auVar162);
          auVar263._0_4_ = auVar132._0_4_ * auVar117._0_4_ + auVar151._0_4_ * auVar229._0_4_;
          auVar263._4_4_ = auVar132._4_4_ * auVar117._4_4_ + auVar151._4_4_ * auVar229._4_4_;
          auVar263._8_4_ = auVar132._8_4_ * auVar117._8_4_ + auVar151._8_4_ * auVar229._8_4_;
          auVar263._12_4_ = auVar132._12_4_ * auVar117._12_4_ + auVar151._12_4_ * auVar229._12_4_;
          auVar92 = vsubps_avx(auVar109,auVar263);
          fVar223 = auVar92._0_4_ + auVar216._0_4_;
          fVar224 = auVar92._0_4_ + auVar162._0_4_;
          auVar216 = vmaxss_avx(ZEXT416((uint)fVar222),ZEXT416((uint)fVar223));
          auVar162 = vminss_avx(ZEXT416((uint)fVar224),ZEXT416((uint)fVar220));
          if (auVar216._0_4_ <= auVar162._0_4_) {
            auVar216 = vmovshdup_avx(auVar117);
            auVar158._0_4_ = auVar116._0_4_ * auVar216._0_4_;
            auVar158._4_4_ = auVar116._4_4_ * auVar216._4_4_;
            auVar158._8_4_ = auVar116._8_4_ * auVar216._8_4_;
            auVar158._12_4_ = auVar116._12_4_ * auVar216._12_4_;
            auVar121._0_4_ = auVar161._0_4_ * auVar216._0_4_;
            auVar121._4_4_ = auVar161._4_4_ * auVar216._4_4_;
            auVar121._8_4_ = auVar161._8_4_ * auVar216._8_4_;
            auVar121._12_4_ = auVar161._12_4_ * auVar216._12_4_;
            auVar162 = vminps_avx(auVar158,auVar121);
            auVar216 = vmaxps_avx(auVar121,auVar158);
            auVar116 = vmovshdup_avx(auVar229);
            auVar214._0_4_ = auVar116._0_4_ * auVar95._0_4_;
            auVar214._4_4_ = auVar116._4_4_ * auVar95._4_4_;
            auVar214._8_4_ = auVar116._8_4_ * auVar95._8_4_;
            auVar214._12_4_ = auVar116._12_4_ * auVar95._12_4_;
            auVar159._0_4_ = auVar116._0_4_ * auVar136._0_4_;
            auVar159._4_4_ = auVar116._4_4_ * auVar136._4_4_;
            auVar159._8_4_ = auVar116._8_4_ * auVar136._8_4_;
            auVar159._12_4_ = auVar116._12_4_ * auVar136._12_4_;
            auVar116 = vminps_avx(auVar214,auVar159);
            auVar234._0_4_ = auVar162._0_4_ + auVar116._0_4_;
            auVar234._4_4_ = auVar162._4_4_ + auVar116._4_4_;
            auVar234._8_4_ = auVar162._8_4_ + auVar116._8_4_;
            auVar234._12_4_ = auVar162._12_4_ + auVar116._12_4_;
            auVar162 = vmaxps_avx(auVar159,auVar214);
            auVar122._0_4_ = auVar216._0_4_ + auVar162._0_4_;
            auVar122._4_4_ = auVar216._4_4_ + auVar162._4_4_;
            auVar122._8_4_ = auVar216._8_4_ + auVar162._8_4_;
            auVar122._12_4_ = auVar216._12_4_ + auVar162._12_4_;
            auVar216 = vsubps_avx(auVar157,auVar122);
            auVar162 = vsubps_avx(auVar157,auVar234);
            auVar215._0_4_ = fVar177 * auVar216._0_4_;
            auVar215._4_4_ = fVar180 * auVar216._4_4_;
            auVar215._8_4_ = fVar196 * auVar216._8_4_;
            auVar215._12_4_ = fVar198 * auVar216._12_4_;
            auVar235._0_4_ = fVar177 * auVar162._0_4_;
            auVar235._4_4_ = fVar180 * auVar162._4_4_;
            auVar235._8_4_ = fVar196 * auVar162._8_4_;
            auVar235._12_4_ = fVar198 * auVar162._12_4_;
            auVar123._0_4_ = fVar150 * auVar216._0_4_;
            auVar123._4_4_ = fVar174 * auVar216._4_4_;
            auVar123._8_4_ = fVar175 * auVar216._8_4_;
            auVar123._12_4_ = fVar176 * auVar216._12_4_;
            auVar160._0_4_ = fVar150 * auVar162._0_4_;
            auVar160._4_4_ = fVar174 * auVar162._4_4_;
            auVar160._8_4_ = fVar175 * auVar162._8_4_;
            auVar160._12_4_ = fVar176 * auVar162._12_4_;
            auVar216 = vminps_avx(auVar215,auVar235);
            auVar162 = vminps_avx(auVar123,auVar160);
            auVar216 = vminps_avx(auVar216,auVar162);
            auVar162 = vmaxps_avx(auVar235,auVar215);
            auVar116 = vmaxps_avx(auVar160,auVar123);
            auVar216 = vhaddps_avx(auVar216,auVar216);
            auVar162 = vmaxps_avx(auVar116,auVar162);
            auVar162 = vhaddps_avx(auVar162,auVar162);
            auVar116 = vmovshdup_avx(auVar92);
            auVar161 = ZEXT416((uint)(auVar116._0_4_ + auVar216._0_4_));
            auVar216 = vmaxss_avx(_local_6b0,auVar161);
            auVar116 = ZEXT416((uint)(auVar116._0_4_ + auVar162._0_4_));
            auVar162 = vminss_avx(auVar116,auVar108);
            if (auVar216._0_4_ <= auVar162._0_4_) {
              uVar87 = 0;
              auVar342 = ZEXT864(0) << 0x20;
              auVar353._8_4_ = 0x3f800000;
              auVar353._0_8_ = &DAT_3f8000003f800000;
              auVar353._12_4_ = 0x3f800000;
              auVar355 = ZEXT1664(auVar353);
              if (fVar223 <= fVar222) {
                auVar264._8_4_ = 0x7fffffff;
                auVar264._0_8_ = 0x7fffffff7fffffff;
                auVar264._12_4_ = 0x7fffffff;
              }
              else {
                auVar264._8_4_ = 0x7fffffff;
                auVar264._0_8_ = 0x7fffffff7fffffff;
                auVar264._12_4_ = 0x7fffffff;
                uVar87 = 0;
                if (fVar224 < fVar220) {
                  auVar216 = vcmpps_avx(auVar116,auVar108,1);
                  auVar162 = vcmpps_avx(_local_6b0,auVar161,1);
                  auVar216 = vandps_avx(auVar162,auVar216);
                  uVar87 = auVar216._0_4_;
                }
              }
              if (((uint)uVar89 < 4 && 0.001 <= fVar221) && (uVar87 & 1) == 0) {
                bVar65 = false;
              }
              else {
                lVar84 = 200;
                do {
                  fVar223 = auVar92._0_4_;
                  fVar221 = 1.0 - fVar223;
                  auVar216 = ZEXT416((uint)(fVar221 * fVar221 * fVar221));
                  auVar216 = vshufps_avx(auVar216,auVar216,0);
                  auVar162 = ZEXT416((uint)(fVar223 * 3.0 * fVar221 * fVar221));
                  auVar162 = vshufps_avx(auVar162,auVar162,0);
                  auVar116 = ZEXT416((uint)(fVar221 * fVar223 * fVar223 * 3.0));
                  auVar116 = vshufps_avx(auVar116,auVar116,0);
                  auVar161 = ZEXT416((uint)(fVar223 * fVar223 * fVar223));
                  auVar161 = vshufps_avx(auVar161,auVar161,0);
                  local_680._0_4_ = auVar11._0_4_;
                  local_680._4_4_ = auVar11._4_4_;
                  fStack_678 = auVar11._8_4_;
                  fStack_674 = auVar11._12_4_;
                  fVar221 = local_550 * auVar216._0_4_ +
                            local_560 * auVar162._0_4_ +
                            auVar161._0_4_ * (float)local_680._0_4_ + local_570 * auVar116._0_4_;
                  fVar223 = fStack_54c * auVar216._4_4_ +
                            fStack_55c * auVar162._4_4_ +
                            auVar161._4_4_ * (float)local_680._4_4_ + fStack_56c * auVar116._4_4_;
                  auVar124._0_8_ = CONCAT44(fVar223,fVar221);
                  auVar124._8_4_ =
                       fStack_548 * auVar216._8_4_ +
                       fStack_558 * auVar162._8_4_ +
                       auVar161._8_4_ * fStack_678 + fStack_568 * auVar116._8_4_;
                  auVar124._12_4_ =
                       fStack_544 * auVar216._12_4_ +
                       fStack_554 * auVar162._12_4_ +
                       auVar161._12_4_ * fStack_674 + fStack_564 * auVar116._12_4_;
                  auVar163._8_8_ = auVar124._0_8_;
                  auVar163._0_8_ = auVar124._0_8_;
                  auVar162 = vshufpd_avx(auVar124,auVar124,1);
                  auVar216 = vmovshdup_avx(auVar92);
                  auVar162 = vsubps_avx(auVar162,auVar163);
                  auVar125._0_4_ = auVar216._0_4_ * auVar162._0_4_ + fVar221;
                  auVar125._4_4_ = auVar216._4_4_ * auVar162._4_4_ + fVar223;
                  auVar125._8_4_ = auVar216._8_4_ * auVar162._8_4_ + fVar221;
                  auVar125._12_4_ = auVar216._12_4_ * auVar162._12_4_ + fVar223;
                  auVar216 = vshufps_avx(auVar125,auVar125,0);
                  auVar162 = vshufps_avx(auVar125,auVar125,0x55);
                  auVar164._0_4_ = auVar117._0_4_ * auVar216._0_4_ + auVar229._0_4_ * auVar162._0_4_
                  ;
                  auVar164._4_4_ = auVar117._4_4_ * auVar216._4_4_ + auVar229._4_4_ * auVar162._4_4_
                  ;
                  auVar164._8_4_ = auVar117._8_4_ * auVar216._8_4_ + auVar229._8_4_ * auVar162._8_4_
                  ;
                  auVar164._12_4_ =
                       auVar117._12_4_ * auVar216._12_4_ + auVar229._12_4_ * auVar162._12_4_;
                  auVar92 = vsubps_avx(auVar92,auVar164);
                  auVar216 = vandps_avx(auVar264,auVar125);
                  auVar162 = vshufps_avx(auVar216,auVar216,0xf5);
                  auVar216 = vmaxss_avx(auVar162,auVar216);
                  if (auVar216._0_4_ < fVar219) {
                    fVar221 = auVar92._0_4_;
                    if ((0.0 <= fVar221) && (fVar221 <= 1.0)) {
                      auVar117 = vmovshdup_avx(auVar92);
                      fVar223 = auVar117._0_4_;
                      if ((0.0 <= fVar223) && (fVar223 <= 1.0)) {
                        auVar117 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2])
                                                 ,ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]
                                                         ),0x1c);
                        auVar136 = vinsertps_avx(auVar117,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                        auVar117 = vdpps_avx(auVar136,local_380,0x7f);
                        auVar229 = vdpps_avx(auVar136,local_390,0x7f);
                        auVar216 = vdpps_avx(auVar136,local_3c0,0x7f);
                        auVar162 = vdpps_avx(auVar136,local_3d0,0x7f);
                        auVar116 = vdpps_avx(auVar136,local_3e0,0x7f);
                        auVar161 = vdpps_avx(auVar136,local_3f0,0x7f);
                        fVar176 = 1.0 - fVar223;
                        auVar95 = vdpps_avx(auVar136,local_3a0,0x7f);
                        auVar136 = vdpps_avx(auVar136,local_3b0,0x7f);
                        fVar177 = 1.0 - fVar221;
                        fVar224 = auVar92._4_4_;
                        fVar150 = auVar92._8_4_;
                        fVar174 = auVar92._12_4_;
                        fVar175 = fVar177 * fVar221 * fVar221 * 3.0;
                        auVar217._0_4_ = fVar221 * fVar221 * fVar221;
                        auVar217._4_4_ = fVar224 * fVar224 * fVar224;
                        auVar217._8_4_ = fVar150 * fVar150 * fVar150;
                        auVar217._12_4_ = fVar174 * fVar174 * fVar174;
                        fVar224 = fVar221 * 3.0 * fVar177 * fVar177;
                        fVar150 = fVar177 * fVar177 * fVar177;
                        fVar221 = (fVar176 * auVar117._0_4_ + fVar223 * auVar216._0_4_) * fVar150 +
                                  (fVar176 * auVar229._0_4_ + fVar223 * auVar162._0_4_) * fVar224 +
                                  fVar175 * (fVar176 * auVar95._0_4_ + fVar223 * auVar116._0_4_) +
                                  auVar217._0_4_ *
                                  (auVar161._0_4_ * fVar223 + fVar176 * auVar136._0_4_);
                        if ((fVar201 <= fVar221) &&
                           (fVar223 = *(float *)(ray + k * 4 + 0x100), fVar221 <= fVar223)) {
                          pGVar13 = (context->scene->geometries).items[uVar82].ptr;
                          if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                            bVar91 = false;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar91 = true,
                                  pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            local_f0 = vshufps_avx(auVar92,auVar92,0x55);
                            auVar117 = vsubps_avx(auVar353,local_f0);
                            fVar174 = local_f0._0_4_;
                            fVar176 = local_f0._4_4_;
                            fVar180 = local_f0._8_4_;
                            fVar196 = local_f0._12_4_;
                            fVar198 = auVar117._0_4_;
                            fVar200 = auVar117._4_4_;
                            fVar295 = auVar117._8_4_;
                            fVar306 = auVar117._12_4_;
                            auVar282._0_4_ =
                                 fVar174 * (float)local_4c0._0_4_ + fVar198 * (float)local_4b0._0_4_
                            ;
                            auVar282._4_4_ =
                                 fVar176 * (float)local_4c0._4_4_ + fVar200 * (float)local_4b0._4_4_
                            ;
                            auVar282._8_4_ = fVar180 * fStack_4b8 + fVar295 * fStack_4a8;
                            auVar282._12_4_ = fVar196 * fStack_4b4 + fVar306 * fStack_4a4;
                            auVar290._0_4_ =
                                 fVar174 * (float)local_500._0_4_ + fVar198 * (float)local_4e0._0_4_
                            ;
                            auVar290._4_4_ =
                                 fVar176 * (float)local_500._4_4_ + fVar200 * (float)local_4e0._4_4_
                            ;
                            auVar290._8_4_ = fVar180 * fStack_4f8 + fVar295 * fStack_4d8;
                            auVar290._12_4_ = fVar196 * fStack_4f4 + fVar306 * fStack_4d4;
                            auVar303._0_4_ =
                                 fVar174 * (float)local_410._0_4_ + fVar198 * (float)local_4f0._0_4_
                            ;
                            auVar303._4_4_ =
                                 fVar176 * (float)local_410._4_4_ + fVar200 * (float)local_4f0._4_4_
                            ;
                            auVar303._8_4_ = fVar180 * fStack_408 + fVar295 * fStack_4e8;
                            auVar303._12_4_ = fVar196 * fStack_404 + fVar306 * fStack_4e4;
                            auVar265._0_4_ = fVar174 * fVar195 + fVar198 * (float)local_4d0._0_4_;
                            auVar265._4_4_ = fVar176 * fVar197 + fVar200 * (float)local_4d0._4_4_;
                            auVar265._8_4_ = fVar180 * fVar199 + fVar295 * fStack_4c8;
                            auVar265._12_4_ = fVar196 * fVar294 + fVar306 * fStack_4c4;
                            auVar162 = vsubps_avx(auVar290,auVar282);
                            auVar116 = vsubps_avx(auVar303,auVar290);
                            auVar161 = vsubps_avx(auVar265,auVar303);
                            local_110 = vshufps_avx(auVar92,auVar92,0);
                            fVar174 = local_110._0_4_;
                            fVar180 = local_110._4_4_;
                            fVar196 = local_110._8_4_;
                            fVar200 = local_110._12_4_;
                            auVar117 = vshufps_avx(ZEXT416((uint)fVar177),ZEXT416((uint)fVar177),0);
                            fVar176 = auVar117._0_4_;
                            fVar177 = auVar117._4_4_;
                            fVar198 = auVar117._8_4_;
                            fVar295 = auVar117._12_4_;
                            auVar117 = vshufps_avx(auVar217,auVar217,0);
                            auVar229 = vshufps_avx(ZEXT416((uint)fVar175),ZEXT416((uint)fVar175),0);
                            auVar216 = vshufps_avx(ZEXT416((uint)fVar224),ZEXT416((uint)fVar224),0);
                            auVar190._0_4_ =
                                 ((auVar116._0_4_ * fVar176 + auVar161._0_4_ * fVar174) * fVar174 +
                                 (auVar162._0_4_ * fVar176 + auVar116._0_4_ * fVar174) * fVar176) *
                                 3.0;
                            auVar190._4_4_ =
                                 ((auVar116._4_4_ * fVar177 + auVar161._4_4_ * fVar180) * fVar180 +
                                 (auVar162._4_4_ * fVar177 + auVar116._4_4_ * fVar180) * fVar177) *
                                 3.0;
                            auVar190._8_4_ =
                                 ((auVar116._8_4_ * fVar198 + auVar161._8_4_ * fVar196) * fVar196 +
                                 (auVar162._8_4_ * fVar198 + auVar116._8_4_ * fVar196) * fVar198) *
                                 3.0;
                            auVar190._12_4_ =
                                 ((auVar116._12_4_ * fVar295 + auVar161._12_4_ * fVar200) * fVar200
                                 + (auVar162._12_4_ * fVar295 + auVar116._12_4_ * fVar200) * fVar295
                                 ) * 3.0;
                            auVar162 = vshufps_avx(ZEXT416((uint)fVar150),ZEXT416((uint)fVar150),0);
                            auVar141._0_4_ =
                                 auVar162._0_4_ * (float)local_420._0_4_ +
                                 auVar216._0_4_ * (float)local_430._0_4_ +
                                 auVar117._0_4_ * (float)local_450._0_4_ +
                                 auVar229._0_4_ * (float)local_440._0_4_;
                            auVar141._4_4_ =
                                 auVar162._4_4_ * (float)local_420._4_4_ +
                                 auVar216._4_4_ * (float)local_430._4_4_ +
                                 auVar117._4_4_ * (float)local_450._4_4_ +
                                 auVar229._4_4_ * (float)local_440._4_4_;
                            auVar141._8_4_ =
                                 auVar162._8_4_ * fStack_418 +
                                 auVar216._8_4_ * fStack_428 +
                                 auVar117._8_4_ * fStack_448 + auVar229._8_4_ * fStack_438;
                            auVar141._12_4_ =
                                 auVar162._12_4_ * fStack_414 +
                                 auVar216._12_4_ * fStack_424 +
                                 auVar117._12_4_ * fStack_444 + auVar229._12_4_ * fStack_434;
                            auVar117 = vshufps_avx(auVar190,auVar190,0xc9);
                            auVar165._0_4_ = auVar141._0_4_ * auVar117._0_4_;
                            auVar165._4_4_ = auVar141._4_4_ * auVar117._4_4_;
                            auVar165._8_4_ = auVar141._8_4_ * auVar117._8_4_;
                            auVar165._12_4_ = auVar141._12_4_ * auVar117._12_4_;
                            auVar117 = vshufps_avx(auVar141,auVar141,0xc9);
                            auVar142._0_4_ = auVar190._0_4_ * auVar117._0_4_;
                            auVar142._4_4_ = auVar190._4_4_ * auVar117._4_4_;
                            auVar142._8_4_ = auVar190._8_4_ * auVar117._8_4_;
                            auVar142._12_4_ = auVar190._12_4_ * auVar117._12_4_;
                            auVar117 = vsubps_avx(auVar142,auVar165);
                            local_170 = vshufps_avx(auVar117,auVar117,0x55);
                            local_180[0] = (RTCHitN)local_170[0];
                            local_180[1] = (RTCHitN)local_170[1];
                            local_180[2] = (RTCHitN)local_170[2];
                            local_180[3] = (RTCHitN)local_170[3];
                            local_180[4] = (RTCHitN)local_170[4];
                            local_180[5] = (RTCHitN)local_170[5];
                            local_180[6] = (RTCHitN)local_170[6];
                            local_180[7] = (RTCHitN)local_170[7];
                            local_180[8] = (RTCHitN)local_170[8];
                            local_180[9] = (RTCHitN)local_170[9];
                            local_180[10] = (RTCHitN)local_170[10];
                            local_180[0xb] = (RTCHitN)local_170[0xb];
                            local_180[0xc] = (RTCHitN)local_170[0xc];
                            local_180[0xd] = (RTCHitN)local_170[0xd];
                            local_180[0xe] = (RTCHitN)local_170[0xe];
                            local_180[0xf] = (RTCHitN)local_170[0xf];
                            local_150 = vshufps_avx(auVar117,auVar117,0xaa);
                            local_160 = local_150;
                            local_130 = vshufps_avx(auVar117,auVar117,0);
                            local_140 = local_130;
                            local_120 = local_110;
                            local_100 = local_f0;
                            local_e0 = local_300._0_8_;
                            uStack_d8 = local_300._8_8_;
                            uStack_d0 = local_300._16_8_;
                            uStack_c8 = local_300._24_8_;
                            local_c0 = local_2e0._0_8_;
                            uStack_b8 = local_2e0._8_8_;
                            uStack_b0 = local_2e0._16_8_;
                            uStack_a8 = local_2e0._24_8_;
                            auVar97 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                            uStack_9c = context->user->instID[0];
                            local_a0 = uStack_9c;
                            uStack_98 = uStack_9c;
                            uStack_94 = uStack_9c;
                            uStack_90 = uStack_9c;
                            uStack_8c = uStack_9c;
                            uStack_84 = auVar97._28_4_;
                            uVar87 = uStack_84;
                            uStack_88 = uStack_9c;
                            uStack_84 = uStack_9c;
                            uStack_7c = context->user->instPrimID[0];
                            local_80 = uStack_7c;
                            uStack_78 = uStack_7c;
                            uStack_74 = uStack_7c;
                            uStack_70 = uStack_7c;
                            uStack_6c = uStack_7c;
                            uStack_68 = uStack_7c;
                            uStack_64 = uStack_7c;
                            *(float *)(ray + k * 4 + 0x100) = fVar221;
                            local_510 = *(undefined8 *)(mm_lookupmask_ps + lVar88);
                            uStack_508 = *(undefined8 *)(mm_lookupmask_ps + lVar88 + 8);
                            local_520 = *(undefined8 *)(mm_lookupmask_ps + uVar83);
                            uStack_518 = *(undefined8 *)(mm_lookupmask_ps + uVar83 + 8);
                            local_480.valid = (int *)&local_520;
                            local_480.geometryUserPtr = pGVar13->userPtr;
                            local_480.context = context->user;
                            local_480.ray = (RTCRayN *)ray;
                            local_480.hit = local_180;
                            local_480.N = 8;
                            if (pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              (*pGVar13->occlusionFilterN)(&local_480);
                              auVar355 = ZEXT1664(CONCAT412(0x3f800000,
                                                            CONCAT48(0x3f800000,
                                                                     &DAT_3f8000003f800000)));
                              auVar342 = ZEXT1664(ZEXT816(0) << 0x40);
                            }
                            auVar77._8_8_ = uStack_518;
                            auVar77._0_8_ = local_520;
                            auVar117 = vpcmpeqd_avx(auVar342._0_16_,auVar77);
                            auVar79._8_8_ = uStack_508;
                            auVar79._0_8_ = local_510;
                            auVar229 = vpcmpeqd_avx(auVar342._0_16_,auVar79);
                            auVar105._16_16_ = auVar229;
                            auVar105._0_16_ = auVar117;
                            auVar19 = auVar97 & ~auVar105;
                            if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (auVar19 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar19 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar19 >> 0x7f,0) == '\0') &&
                                  (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                                  ) && SUB321(auVar19 >> 0xbf,0) == '\0') &&
                                (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                                && -1 < auVar19[0x1f]) {
                              auVar106._0_4_ = auVar117._0_4_ ^ auVar97._0_4_;
                              auVar106._4_4_ = auVar117._4_4_ ^ auVar97._4_4_;
                              auVar106._8_4_ = auVar117._8_4_ ^ auVar97._8_4_;
                              auVar106._12_4_ = auVar117._12_4_ ^ auVar97._12_4_;
                              auVar106._16_4_ = auVar229._0_4_ ^ auVar97._16_4_;
                              auVar106._20_4_ = auVar229._4_4_ ^ auVar97._20_4_;
                              auVar106._24_4_ = auVar229._8_4_ ^ auVar97._24_4_;
                              auVar106._28_4_ = auVar229._12_4_ ^ uVar87;
                            }
                            else {
                              p_Var14 = context->args->filter;
                              if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
                                (*p_Var14)(&local_480);
                                auVar355 = ZEXT1664(CONCAT412(0x3f800000,
                                                              CONCAT48(0x3f800000,
                                                                       &DAT_3f8000003f800000)));
                                auVar342 = ZEXT1664(ZEXT816(0) << 0x40);
                              }
                              auVar78._8_8_ = uStack_518;
                              auVar78._0_8_ = local_520;
                              auVar117 = vpcmpeqd_avx(auVar342._0_16_,auVar78);
                              auVar80._8_8_ = uStack_508;
                              auVar80._0_8_ = local_510;
                              auVar229 = vpcmpeqd_avx(auVar342._0_16_,auVar80);
                              auVar131._16_16_ = auVar229;
                              auVar131._0_16_ = auVar117;
                              auVar106._0_4_ = auVar117._0_4_ ^ auVar97._0_4_;
                              auVar106._4_4_ = auVar117._4_4_ ^ auVar97._4_4_;
                              auVar106._8_4_ = auVar117._8_4_ ^ auVar97._8_4_;
                              auVar106._12_4_ = auVar117._12_4_ ^ auVar97._12_4_;
                              auVar106._16_4_ = auVar229._0_4_ ^ auVar97._16_4_;
                              auVar106._20_4_ = auVar229._4_4_ ^ auVar97._20_4_;
                              auVar106._24_4_ = auVar229._8_4_ ^ auVar97._24_4_;
                              auVar106._28_4_ = auVar229._12_4_ ^ uVar87;
                              auVar149._8_4_ = 0xff800000;
                              auVar149._0_8_ = 0xff800000ff800000;
                              auVar149._12_4_ = 0xff800000;
                              auVar149._16_4_ = 0xff800000;
                              auVar149._20_4_ = 0xff800000;
                              auVar149._24_4_ = 0xff800000;
                              auVar149._28_4_ = 0xff800000;
                              auVar97 = vblendvps_avx(auVar149,*(undefined1 (*) [32])
                                                                (local_480.ray + 0x100),auVar131);
                              *(undefined1 (*) [32])(local_480.ray + 0x100) = auVar97;
                            }
                            bVar73 = (auVar106 >> 0x1f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar74 = (auVar106 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar72 = (auVar106 >> 0x5f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar71 = SUB321(auVar106 >> 0x7f,0) != '\0';
                            bVar70 = (auVar106 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0;
                            bVar69 = SUB321(auVar106 >> 0xbf,0) != '\0';
                            bVar66 = (auVar106 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0;
                            bVar91 = auVar106[0x1f] < '\0';
                            if (((((((!bVar73 && !bVar74) && !bVar72) && !bVar71) && !bVar70) &&
                                 !bVar69) && !bVar66) && !bVar91) {
                              *(float *)(ray + k * 4 + 0x100) = fVar223;
                            }
                            bVar91 = ((((((bVar73 || bVar74) || bVar72) || bVar71) || bVar70) ||
                                      bVar69) || bVar66) || bVar91;
                          }
                          bVar81 = (bool)(bVar81 | bVar91);
                        }
                      }
                    }
                    break;
                  }
                  lVar84 = lVar84 + -1;
                } while (lVar84 != 0);
              }
              goto LAB_010e67f7;
            }
          }
          goto LAB_010e6b7e;
        }
      }
LAB_010e67f7:
    } while (bVar65);
    local_400 = vinsertps_avx(ZEXT416((uint)fVar222),ZEXT416((uint)fVar220),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }